

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_intra_pred_luma_planar_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined6 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined2 uVar49;
  short sVar50;
  short sVar51;
  undefined8 *puVar52;
  long lVar53;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  ushort uVar54;
  short sVar58;
  ushort uVar71;
  ushort uVar75;
  ushort uVar79;
  ushort uVar83;
  ushort uVar87;
  ushort uVar91;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  __m128i res_temp_8x16b_3;
  __m128i src_temp_8x16b_2;
  __m128i res_temp7_8x16b_2;
  __m128i res_temp6_8x16b_2;
  __m128i res_temp5_8x16b_2;
  __m128i res_temp4_8x16b_2;
  __m128i res_temp3_8x16b_2;
  __m128i res_temp2_8x16b_2;
  __m128i res_temp1_8x16b_2;
  __m128i res_temp_8x16b_2;
  __m128i src_temp_8x16b_1;
  __m128i res_temp7_8x16b_1;
  __m128i res_temp6_8x16b_1;
  __m128i res_temp5_8x16b_1;
  __m128i res_temp4_8x16b_1;
  __m128i res_temp3_8x16b_1;
  __m128i res_temp2_8x16b_1;
  __m128i res_temp1_8x16b_1;
  __m128i res_temp_8x16b_1;
  __m128i src_temp1_8x16b;
  __m128i src_temp_8x16b;
  __m128i res_temp7_8x16b;
  __m128i res_temp6_8x16b;
  __m128i res_temp5_8x16b;
  __m128i res_temp4_8x16b;
  __m128i res_temp3_8x16b;
  __m128i res_temp2_8x16b;
  __m128i res_temp1_8x16b;
  __m128i res_temp_8x16b;
  __m128i row3_16x8b;
  __m128i row2_16x8b;
  __m128i row1_16x8b;
  __m128i row_16x8b;
  __m128i nt_row3_16x8b;
  __m128i nt_row2_16x8b;
  __m128i nt_row1_16x8b;
  __m128i nt_row_16x8b;
  __m128i const_temp8_4x32b;
  __m128i const_temp7_4x32b;
  __m128i zero_8x16b;
  __m128i const_temp6_4x32b;
  __m128i const_temp5_4x32b;
  __m128i col_8x16b;
  __m128i const_temp4_4x32b;
  __m128i const_temp3_4x32b;
  __m128i const_temp2_4x32b;
  __m128i const_temp1_4x32b;
  __m128i const_temp_4x32b;
  __m128i pu1_ref_16x8b;
  UWORD16 temp;
  WORD32 three_nt;
  WORD32 two_nt;
  WORD32 col;
  WORD32 row;
  char cStack_17f6;
  byte bStack_17f5;
  char cStack_17f4;
  byte bStack_17f3;
  char cStack_17f2;
  byte bStack_17f1;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 local_1768;
  undefined8 local_1758;
  undefined8 local_1748;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  short local_1548;
  short sStack_1546;
  short sStack_1544;
  short sStack_1542;
  undefined8 local_1538;
  int local_14bc;
  uint local_14b8;
  short local_14b0;
  byte bStack_13b7;
  byte bStack_13b6;
  byte bStack_13b5;
  undefined1 local_1348;
  undefined1 uStack_1347;
  undefined1 uStack_1346;
  undefined1 uStack_1345;
  undefined1 uStack_1344;
  undefined1 uStack_1343;
  undefined1 uStack_1342;
  undefined1 uStack_1341;
  undefined1 local_1308;
  undefined1 uStack_1307;
  undefined1 uStack_1306;
  undefined1 uStack_1305;
  undefined1 uStack_1304;
  undefined1 uStack_1303;
  undefined1 uStack_1302;
  undefined1 uStack_1301;
  undefined1 local_12e8;
  undefined1 uStack_12e7;
  undefined1 uStack_12e6;
  undefined1 uStack_12e5;
  undefined1 uStack_12e4;
  undefined1 uStack_12e3;
  undefined1 uStack_12e2;
  undefined1 uStack_12e1;
  undefined1 local_12c8;
  undefined1 uStack_12c7;
  undefined1 uStack_12c6;
  undefined1 uStack_12c5;
  undefined1 uStack_12c4;
  undefined1 uStack_12c3;
  undefined1 uStack_12c2;
  undefined1 uStack_12c1;
  short sStack_1276;
  short sStack_1274;
  short sStack_1272;
  short sStack_1256;
  short sStack_1254;
  short sStack_1252;
  short sStack_1246;
  short sStack_1244;
  short sStack_1242;
  short local_1168;
  short sStack_1166;
  short sStack_1164;
  short sStack_1162;
  short sStack_1160;
  short sStack_115e;
  short sStack_115c;
  short sStack_115a;
  short local_1158;
  short sStack_1156;
  short sStack_1154;
  short sStack_1152;
  short sStack_1150;
  short sStack_114e;
  short sStack_114c;
  short sStack_114a;
  short local_1148;
  short sStack_1146;
  short sStack_1144;
  short sStack_1142;
  short sStack_1140;
  short sStack_113e;
  short sStack_113c;
  short sStack_113a;
  short local_1138;
  short sStack_1136;
  short sStack_1134;
  short sStack_1132;
  short sStack_1130;
  short sStack_112e;
  short sStack_112c;
  short sStack_112a;
  short local_1128;
  short sStack_1126;
  short sStack_1124;
  short sStack_1122;
  short sStack_1120;
  short sStack_111e;
  short sStack_111c;
  short sStack_111a;
  short local_1118;
  short sStack_1116;
  short sStack_1114;
  short sStack_1112;
  short sStack_1110;
  short sStack_110e;
  short sStack_110c;
  short sStack_110a;
  short local_1108;
  short sStack_1106;
  short sStack_1104;
  short sStack_1102;
  short sStack_1100;
  short sStack_10fe;
  short sStack_10fc;
  short sStack_10fa;
  short local_10f8;
  short sStack_10f6;
  short sStack_10f4;
  short sStack_10f2;
  short sStack_10f0;
  short sStack_10ee;
  short sStack_10ec;
  short sStack_10ea;
  short local_1098;
  short sStack_1096;
  short sStack_1094;
  short sStack_1092;
  short sStack_1090;
  short sStack_108e;
  short sStack_108c;
  short sStack_108a;
  short local_fe8;
  short sStack_fe6;
  short sStack_fe4;
  short sStack_fe2;
  short sStack_fe0;
  short sStack_fde;
  short sStack_fdc;
  short sStack_fda;
  short local_fd8;
  short sStack_fd6;
  short sStack_fd4;
  short sStack_fd2;
  short sStack_fd0;
  short sStack_fce;
  short sStack_fcc;
  short sStack_fca;
  short local_fc8;
  short sStack_fc6;
  short sStack_fc4;
  short sStack_fc2;
  short sStack_fc0;
  short sStack_fbe;
  short sStack_fbc;
  short sStack_fba;
  short local_fb8;
  short sStack_fb6;
  short sStack_fb4;
  short sStack_fb2;
  short sStack_fb0;
  short sStack_fae;
  short sStack_fac;
  short sStack_faa;
  short local_fa8;
  short sStack_fa6;
  short sStack_fa4;
  short sStack_fa2;
  short sStack_fa0;
  short sStack_f9e;
  short sStack_f9c;
  short sStack_f9a;
  short local_f98;
  short sStack_f96;
  short sStack_f94;
  short sStack_f92;
  short sStack_f90;
  short sStack_f8e;
  short sStack_f8c;
  short sStack_f8a;
  short local_f88;
  short sStack_f86;
  short sStack_f84;
  short sStack_f82;
  short sStack_f80;
  short sStack_f7e;
  short sStack_f7c;
  short sStack_f7a;
  short local_f78;
  short sStack_f76;
  short sStack_f74;
  short sStack_f72;
  short sStack_f70;
  short sStack_f6e;
  short sStack_f6c;
  short sStack_f6a;
  short local_f18;
  short sStack_f16;
  short sStack_f14;
  short sStack_f12;
  short sStack_f10;
  short sStack_f0e;
  short sStack_f0c;
  short sStack_f0a;
  short local_e68;
  short sStack_e66;
  short sStack_e64;
  short sStack_e62;
  short sStack_e60;
  short sStack_e5e;
  short sStack_e5c;
  short sStack_e5a;
  short local_e58;
  short sStack_e56;
  short sStack_e54;
  short sStack_e52;
  short sStack_e50;
  short sStack_e4e;
  short sStack_e4c;
  short sStack_e4a;
  short local_e48;
  short sStack_e46;
  short sStack_e44;
  short sStack_e42;
  short sStack_e40;
  short sStack_e3e;
  short sStack_e3c;
  short sStack_e3a;
  short local_e38;
  short sStack_e36;
  short sStack_e34;
  short sStack_e32;
  short sStack_e30;
  short sStack_e2e;
  short sStack_e2c;
  short sStack_e2a;
  short local_e28;
  short sStack_e26;
  short sStack_e24;
  short sStack_e22;
  short sStack_e20;
  short sStack_e1e;
  short sStack_e1c;
  short sStack_e1a;
  short local_e18;
  short sStack_e16;
  short sStack_e14;
  short sStack_e12;
  short sStack_e10;
  short sStack_e0e;
  short sStack_e0c;
  short sStack_e0a;
  short local_e08;
  short sStack_e06;
  short sStack_e04;
  short sStack_e02;
  short sStack_e00;
  short sStack_dfe;
  short sStack_dfc;
  short sStack_dfa;
  short local_df8;
  short sStack_df6;
  short sStack_df4;
  short sStack_df2;
  short sStack_df0;
  short sStack_dee;
  short sStack_dec;
  short sStack_dea;
  short local_d98;
  short sStack_d96;
  short sStack_d94;
  short sStack_d92;
  short sStack_d90;
  short sStack_d8e;
  short sStack_d8c;
  short sStack_d8a;
  ushort uStack_d76;
  ushort uStack_d74;
  ushort uStack_d72;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  short local_808;
  short sStack_806;
  short sStack_804;
  short sStack_802;
  short sStack_800;
  short sStack_7fe;
  short sStack_7fc;
  short sStack_7fa;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  undefined1 uStack_750;
  undefined1 uStack_74f;
  undefined1 uStack_74e;
  undefined1 uStack_74d;
  undefined1 uStack_74c;
  undefined1 uStack_74b;
  undefined1 uStack_74a;
  undefined1 uStack_749;
  undefined1 uStack_730;
  undefined1 uStack_72f;
  undefined1 uStack_72e;
  undefined1 uStack_72d;
  undefined1 uStack_72c;
  undefined1 uStack_72b;
  undefined1 uStack_72a;
  undefined1 uStack_729;
  undefined1 uStack_710;
  undefined1 uStack_70f;
  undefined1 uStack_70e;
  undefined1 uStack_70d;
  undefined1 uStack_70c;
  undefined1 uStack_70b;
  undefined1 uStack_70a;
  undefined1 uStack_709;
  ushort uStack_3e6;
  ushort uStack_3e4;
  ushort uStack_3e2;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  ushort uStack_1b6;
  ushort uStack_1b4;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  ushort uStack_196;
  ushort uStack_194;
  ushort uStack_176;
  ushort uStack_174;
  ushort uStack_172;
  ushort uStack_166;
  ushort uStack_164;
  int temp1;
  __m128i src_temp_8x16b_3;
  __m128i res_temp3_8x16b_3;
  __m128i res_temp2_8x16b_3;
  __m128i res_temp1_8x16b_3;
  __m128i row_8x16b;
  
  iVar6 = in_R8D * 2;
  uVar49 = CONCAT11(*(undefined1 *)(in_RDI + (in_R8D + -1)),
                    *(undefined1 *)((long)(in_R8D * 3) + 1 + in_RDI));
  uVar4 = CONCAT26(uVar49,CONCAT24(uVar49,CONCAT22(uVar49,uVar49)));
  uVar5 = CONCAT26(uVar49,CONCAT24(uVar49,CONCAT22(uVar49,uVar49)));
  local_14b0 = (short)in_R8D;
  if (in_R8D == 0x20) {
    local_1598 = 0x1f1c1f1d1f1e1f1f;
    uStack_1590 = 0x1f181f191f1a1f1b;
    local_15d8 = 0x104010301020101;
    uStack_15d0 = 0x108010701060105;
    for (local_14b8 = 0; (int)local_14b8 < 0x20; local_14b8 = local_14b8 + 1) {
      uStack_1650._0_1_ = *(undefined1 *)(in_RDI + (int)(~local_14b8 + iVar6));
      local_788 = (short)local_1598;
      sStack_786 = (short)((ulong)local_1598 >> 0x10);
      sStack_784 = (short)((ulong)local_1598 >> 0x20);
      sStack_782 = (short)((ulong)local_1598 >> 0x30);
      sStack_780 = (short)uStack_1590;
      sStack_77e = (short)((ulong)uStack_1590 >> 0x10);
      sStack_77c = (short)((ulong)uStack_1590 >> 0x20);
      sStack_77a = (short)((ulong)uStack_1590 >> 0x30);
      local_d98 = (short)local_15d8;
      sStack_d96 = (short)((ulong)local_15d8 >> 0x10);
      sStack_d94 = (short)((ulong)local_15d8 >> 0x20);
      sStack_d92 = (short)((ulong)local_15d8 >> 0x30);
      sStack_d90 = (short)uStack_15d0;
      sStack_d8e = (short)((ulong)uStack_15d0 >> 0x10);
      sStack_d8c = (short)((ulong)uStack_15d0 >> 0x20);
      sStack_d8a = (short)((ulong)uStack_15d0 >> 0x30);
      puVar52 = (undefined8 *)(in_RDI + 1 + (long)iVar6);
      uVar7 = *puVar52;
      uVar8 = puVar52[1];
      puVar52 = (undefined8 *)(in_RDI + 0x11 + (long)iVar6);
      uVar9 = *puVar52;
      uVar10 = puVar52[1];
      local_12c8 = (undefined1)uVar7;
      uStack_12c7 = (undefined1)((ulong)uVar7 >> 8);
      uStack_12c6 = (undefined1)((ulong)uVar7 >> 0x10);
      uStack_12c5 = (undefined1)((ulong)uVar7 >> 0x18);
      uStack_12c4 = (undefined1)((ulong)uVar7 >> 0x20);
      uStack_12c3 = (undefined1)((ulong)uVar7 >> 0x28);
      uStack_12c2 = (undefined1)((ulong)uVar7 >> 0x30);
      uStack_12c1 = (undefined1)((ulong)uVar7 >> 0x38);
      local_1658._0_2_ = CONCAT11(local_12c8,(undefined1)uStack_1650);
      local_1658._0_3_ = CONCAT12((undefined1)uStack_1650,(undefined2)local_1658);
      local_1658._0_4_ = CONCAT13(uStack_12c7,(undefined3)local_1658);
      local_1658._0_5_ = CONCAT14((undefined1)uStack_1650,(undefined4)local_1658);
      local_1658._0_6_ = CONCAT15(uStack_12c6,(undefined5)local_1658);
      local_1658._0_7_ = CONCAT16((undefined1)uStack_1650,(undefined6)local_1658);
      local_1658 = CONCAT17(uStack_12c5,(undefined7)local_1658);
      uStack_1650._1_1_ = uStack_12c4;
      uStack_1650._2_1_ = (undefined1)uStack_1650;
      uStack_1650._3_1_ = uStack_12c3;
      uStack_1650._4_1_ = (undefined1)uStack_1650;
      uStack_1650._5_1_ = uStack_12c2;
      uStack_1650._6_1_ = (undefined1)uStack_1650;
      uStack_1650._7_1_ = uStack_12c1;
      uStack_710 = (undefined1)uVar8;
      uStack_70f = (undefined1)((ulong)uVar8 >> 8);
      uStack_70e = (undefined1)((ulong)uVar8 >> 0x10);
      uStack_70d = (undefined1)((ulong)uVar8 >> 0x18);
      uStack_70c = (undefined1)((ulong)uVar8 >> 0x20);
      uStack_70b = (undefined1)((ulong)uVar8 >> 0x28);
      uStack_70a = (undefined1)((ulong)uVar8 >> 0x30);
      uStack_709 = (undefined1)((ulong)uVar8 >> 0x38);
      local_1668._0_2_ = CONCAT11(uStack_710,(undefined1)uStack_1650);
      local_1668._0_3_ = CONCAT12((undefined1)uStack_1650,(undefined2)local_1668);
      local_1668._0_4_ = CONCAT13(uStack_70f,(undefined3)local_1668);
      local_1668._0_5_ = CONCAT14((undefined1)uStack_1650,(undefined4)local_1668);
      local_1668._0_6_ = CONCAT15(uStack_70e,(undefined5)local_1668);
      local_1668._0_7_ = CONCAT16((undefined1)uStack_1650,(undefined6)local_1668);
      local_1668 = CONCAT17(uStack_70d,(undefined7)local_1668);
      uStack_1660._0_1_ = (undefined1)uStack_1650;
      uStack_1660._1_1_ = uStack_70c;
      uStack_1660._2_1_ = (undefined1)uStack_1650;
      uStack_1660._3_1_ = uStack_70b;
      uStack_1660._4_1_ = (undefined1)uStack_1650;
      uStack_1660._5_1_ = uStack_70a;
      uStack_1660._6_1_ = (undefined1)uStack_1650;
      uStack_1660._7_1_ = uStack_709;
      local_12e8 = (undefined1)uVar9;
      uStack_12e7 = (undefined1)((ulong)uVar9 >> 8);
      uStack_12e6 = (undefined1)((ulong)uVar9 >> 0x10);
      uStack_12e5 = (undefined1)((ulong)uVar9 >> 0x18);
      uStack_12e4 = (undefined1)((ulong)uVar9 >> 0x20);
      uStack_12e3 = (undefined1)((ulong)uVar9 >> 0x28);
      uStack_12e2 = (undefined1)((ulong)uVar9 >> 0x30);
      uStack_12e1 = (undefined1)((ulong)uVar9 >> 0x38);
      local_1678._0_2_ = CONCAT11(local_12e8,(undefined1)uStack_1650);
      local_1678._0_3_ = CONCAT12((undefined1)uStack_1650,(undefined2)local_1678);
      local_1678._0_4_ = CONCAT13(uStack_12e7,(undefined3)local_1678);
      local_1678._0_5_ = CONCAT14((undefined1)uStack_1650,(undefined4)local_1678);
      local_1678._0_6_ = CONCAT15(uStack_12e6,(undefined5)local_1678);
      local_1678._0_7_ = CONCAT16((undefined1)uStack_1650,(undefined6)local_1678);
      local_1678 = CONCAT17(uStack_12e5,(undefined7)local_1678);
      uStack_1670._0_1_ = (undefined1)uStack_1650;
      uStack_1670._1_1_ = uStack_12e4;
      uStack_1670._2_1_ = (undefined1)uStack_1650;
      uStack_1670._3_1_ = uStack_12e3;
      uStack_1670._4_1_ = (undefined1)uStack_1650;
      uStack_1670._5_1_ = uStack_12e2;
      uStack_1670._6_1_ = (undefined1)uStack_1650;
      uStack_1670._7_1_ = uStack_12e1;
      uStack_730 = (undefined1)uVar10;
      uStack_72f = (undefined1)((ulong)uVar10 >> 8);
      uStack_72e = (undefined1)((ulong)uVar10 >> 0x10);
      uStack_72d = (undefined1)((ulong)uVar10 >> 0x18);
      uStack_72c = (undefined1)((ulong)uVar10 >> 0x20);
      uStack_72b = (undefined1)((ulong)uVar10 >> 0x28);
      uStack_72a = (undefined1)((ulong)uVar10 >> 0x30);
      uStack_729 = (undefined1)((ulong)uVar10 >> 0x38);
      local_1688._0_2_ = CONCAT11(uStack_730,(undefined1)uStack_1650);
      local_1688._0_3_ = CONCAT12((undefined1)uStack_1650,(undefined2)local_1688);
      local_1688._0_4_ = CONCAT13(uStack_72f,(undefined3)local_1688);
      local_1688._0_5_ = CONCAT14((undefined1)uStack_1650,(undefined4)local_1688);
      local_1688._0_6_ = CONCAT15(uStack_72e,(undefined5)local_1688);
      local_1688._0_7_ = CONCAT16((undefined1)uStack_1650,(undefined6)local_1688);
      local_1688 = CONCAT17(uStack_72d,(undefined7)local_1688);
      uStack_1680._0_1_ = (undefined1)uStack_1650;
      uStack_1680._1_1_ = uStack_72c;
      uStack_1680._2_1_ = (undefined1)uStack_1650;
      uStack_1680._3_1_ = uStack_72b;
      uStack_1680._4_1_ = (undefined1)uStack_1650;
      uStack_1680._5_1_ = uStack_72a;
      uStack_1680._6_1_ = (undefined1)uStack_1650;
      uStack_1680._7_1_ = uStack_729;
      auVar48._8_8_ = uVar5;
      auVar48._0_8_ = uVar4;
      auVar47._8_8_ = uStack_15d0;
      auVar47._0_8_ = local_15d8;
      auVar59 = pmaddubsw(auVar48,auVar47);
      auVar45._2_2_ = sStack_d96 + 8;
      auVar45._0_2_ = local_d98 + 8;
      auVar45._4_2_ = sStack_d94 + 8;
      auVar45._6_2_ = sStack_d92 + 8;
      auVar45._10_2_ = sStack_d8e + 8;
      auVar45._8_2_ = sStack_d90 + 8;
      auVar45._12_2_ = sStack_d8c + 8;
      auVar45._14_2_ = sStack_d8a + 8;
      auVar46._8_8_ = uVar5;
      auVar46._0_8_ = uVar4;
      auVar60 = pmaddubsw(auVar46,auVar45);
      auVar43._2_2_ = sStack_d96 + 0x10;
      auVar43._0_2_ = local_d98 + 0x10;
      auVar43._4_2_ = sStack_d94 + 0x10;
      auVar43._6_2_ = sStack_d92 + 0x10;
      auVar43._10_2_ = sStack_d8e + 0x10;
      auVar43._8_2_ = sStack_d90 + 0x10;
      auVar43._12_2_ = sStack_d8c + 0x10;
      auVar43._14_2_ = sStack_d8a + 0x10;
      auVar44._8_8_ = uVar5;
      auVar44._0_8_ = uVar4;
      auVar61 = pmaddubsw(auVar44,auVar43);
      auVar41._2_2_ = sStack_d96 + 0x18;
      auVar41._0_2_ = local_d98 + 0x18;
      auVar41._4_2_ = sStack_d94 + 0x18;
      auVar41._6_2_ = sStack_d92 + 0x18;
      auVar41._10_2_ = sStack_d8e + 0x18;
      auVar41._8_2_ = sStack_d90 + 0x18;
      auVar41._12_2_ = sStack_d8c + 0x18;
      auVar41._14_2_ = sStack_d8a + 0x18;
      auVar42._8_8_ = uVar5;
      auVar42._0_8_ = uVar4;
      auVar62 = pmaddubsw(auVar42,auVar41);
      auVar40._8_8_ = uStack_1650;
      auVar40._0_8_ = local_1658;
      auVar39._8_8_ = uStack_1590;
      auVar39._0_8_ = local_1598;
      auVar63 = pmaddubsw(auVar40,auVar39);
      auVar37._2_2_ = sStack_786 + -8;
      auVar37._0_2_ = local_788 + -8;
      auVar37._4_2_ = sStack_784 + -8;
      auVar37._6_2_ = sStack_782 + -8;
      auVar37._10_2_ = sStack_77e + -8;
      auVar37._8_2_ = sStack_780 + -8;
      auVar37._12_2_ = sStack_77c + -8;
      auVar37._14_2_ = sStack_77a + -8;
      auVar38._8_8_ = uStack_1660;
      auVar38._0_8_ = local_1668;
      auVar64 = pmaddubsw(auVar38,auVar37);
      auVar35._2_2_ = sStack_786 + -0x10;
      auVar35._0_2_ = local_788 + -0x10;
      auVar35._4_2_ = sStack_784 + -0x10;
      auVar35._6_2_ = sStack_782 + -0x10;
      auVar35._10_2_ = sStack_77e + -0x10;
      auVar35._8_2_ = sStack_780 + -0x10;
      auVar35._12_2_ = sStack_77c + -0x10;
      auVar35._14_2_ = sStack_77a + -0x10;
      auVar36._8_8_ = uStack_1670;
      auVar36._0_8_ = local_1678;
      auVar65 = pmaddubsw(auVar36,auVar35);
      auVar33._2_2_ = sStack_786 + -0x18;
      auVar33._0_2_ = local_788 + -0x18;
      auVar33._4_2_ = sStack_784 + -0x18;
      auVar33._6_2_ = sStack_782 + -0x18;
      auVar33._10_2_ = sStack_77e + -0x18;
      auVar33._8_2_ = sStack_780 + -0x18;
      auVar33._12_2_ = sStack_77c + -0x18;
      auVar33._14_2_ = sStack_77a + -0x18;
      auVar34._8_8_ = uStack_1680;
      auVar34._0_8_ = local_1688;
      auVar66 = pmaddubsw(auVar34,auVar33);
      local_df8 = auVar59._0_2_;
      sStack_df6 = auVar59._2_2_;
      sStack_df4 = auVar59._4_2_;
      sStack_df2 = auVar59._6_2_;
      sStack_df0 = auVar59._8_2_;
      sStack_dee = auVar59._10_2_;
      sStack_dec = auVar59._12_2_;
      sStack_dea = auVar59._14_2_;
      local_e08 = auVar63._0_2_;
      sStack_e06 = auVar63._2_2_;
      sStack_e04 = auVar63._4_2_;
      sStack_e02 = auVar63._6_2_;
      sStack_e00 = auVar63._8_2_;
      sStack_dfe = auVar63._10_2_;
      sStack_dfc = auVar63._12_2_;
      sStack_dfa = auVar63._14_2_;
      local_e18 = auVar60._0_2_;
      sStack_e16 = auVar60._2_2_;
      sStack_e14 = auVar60._4_2_;
      sStack_e12 = auVar60._6_2_;
      sStack_e10 = auVar60._8_2_;
      sStack_e0e = auVar60._10_2_;
      sStack_e0c = auVar60._12_2_;
      sStack_e0a = auVar60._14_2_;
      local_e28 = auVar64._0_2_;
      sStack_e26 = auVar64._2_2_;
      sStack_e24 = auVar64._4_2_;
      sStack_e22 = auVar64._6_2_;
      sStack_e20 = auVar64._8_2_;
      sStack_e1e = auVar64._10_2_;
      sStack_e1c = auVar64._12_2_;
      sStack_e1a = auVar64._14_2_;
      local_e38 = auVar61._0_2_;
      sStack_e36 = auVar61._2_2_;
      sStack_e34 = auVar61._4_2_;
      sStack_e32 = auVar61._6_2_;
      sStack_e30 = auVar61._8_2_;
      sStack_e2e = auVar61._10_2_;
      sStack_e2c = auVar61._12_2_;
      sStack_e2a = auVar61._14_2_;
      local_e48 = auVar65._0_2_;
      sStack_e46 = auVar65._2_2_;
      sStack_e44 = auVar65._4_2_;
      sStack_e42 = auVar65._6_2_;
      sStack_e40 = auVar65._8_2_;
      sStack_e3e = auVar65._10_2_;
      sStack_e3c = auVar65._12_2_;
      sStack_e3a = auVar65._14_2_;
      local_e58 = auVar62._0_2_;
      sStack_e56 = auVar62._2_2_;
      sStack_e54 = auVar62._4_2_;
      sStack_e52 = auVar62._6_2_;
      sStack_e50 = auVar62._8_2_;
      sStack_e4e = auVar62._10_2_;
      sStack_e4c = auVar62._12_2_;
      sStack_e4a = auVar62._14_2_;
      local_e68 = auVar66._0_2_;
      sStack_e66 = auVar66._2_2_;
      sStack_e64 = auVar66._4_2_;
      sStack_e62 = auVar66._6_2_;
      sStack_e60 = auVar66._8_2_;
      sStack_e5e = auVar66._10_2_;
      sStack_e5c = auVar66._12_2_;
      sStack_e5a = auVar66._14_2_;
      uVar54 = (ushort)(local_df8 + local_e08 + local_14b0) >> 6;
      uVar71 = (ushort)(sStack_df6 + sStack_e06 + local_14b0) >> 6;
      uVar75 = (ushort)(sStack_df4 + sStack_e04 + local_14b0) >> 6;
      uVar79 = (ushort)(sStack_df2 + sStack_e02 + local_14b0) >> 6;
      uVar83 = (ushort)(sStack_df0 + sStack_e00 + local_14b0) >> 6;
      uVar87 = (ushort)(sStack_dee + sStack_dfe + local_14b0) >> 6;
      uVar91 = (ushort)(sStack_dec + sStack_dfc + local_14b0) >> 6;
      uVar95 = (ushort)(sStack_dea + sStack_dfa + local_14b0) >> 6;
      uVar55 = (ushort)(local_e18 + local_e28 + local_14b0) >> 6;
      uVar72 = (ushort)(sStack_e16 + sStack_e26 + local_14b0) >> 6;
      uVar76 = (ushort)(sStack_e14 + sStack_e24 + local_14b0) >> 6;
      uVar80 = (ushort)(sStack_e12 + sStack_e22 + local_14b0) >> 6;
      uVar84 = (ushort)(sStack_e10 + sStack_e20 + local_14b0) >> 6;
      uVar88 = (ushort)(sStack_e0e + sStack_e1e + local_14b0) >> 6;
      uVar92 = (ushort)(sStack_e0c + sStack_e1c + local_14b0) >> 6;
      uVar96 = (ushort)(sStack_e0a + sStack_e1a + local_14b0) >> 6;
      uVar56 = (ushort)(local_e38 + local_e48 + local_14b0) >> 6;
      uVar73 = (ushort)(sStack_e36 + sStack_e46 + local_14b0) >> 6;
      uVar77 = (ushort)(sStack_e34 + sStack_e44 + local_14b0) >> 6;
      uVar81 = (ushort)(sStack_e32 + sStack_e42 + local_14b0) >> 6;
      uVar85 = (ushort)(sStack_e30 + sStack_e40 + local_14b0) >> 6;
      uVar89 = (ushort)(sStack_e2e + sStack_e3e + local_14b0) >> 6;
      uVar93 = (ushort)(sStack_e2c + sStack_e3c + local_14b0) >> 6;
      uVar97 = (ushort)(sStack_e2a + sStack_e3a + local_14b0) >> 6;
      uVar57 = (ushort)(local_e58 + local_e68 + local_14b0) >> 6;
      uVar74 = (ushort)(sStack_e56 + sStack_e66 + local_14b0) >> 6;
      uVar78 = (ushort)(sStack_e54 + sStack_e64 + local_14b0) >> 6;
      uVar82 = (ushort)(sStack_e52 + sStack_e62 + local_14b0) >> 6;
      uVar86 = (ushort)(sStack_e50 + sStack_e60 + local_14b0) >> 6;
      uVar90 = (ushort)(sStack_e4e + sStack_e5e + local_14b0) >> 6;
      uVar94 = (ushort)(sStack_e4c + sStack_e5c + local_14b0) >> 6;
      uVar98 = (ushort)(sStack_e4a + sStack_e5a + local_14b0) >> 6;
      local_1618._0_2_ =
           CONCAT11((uVar71 != 0) * (uVar71 < 0x100) * (char)uVar71 - (0xff < uVar71),
                    (uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 - (0xff < uVar54));
      local_1618._0_3_ =
           CONCAT12((uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 - (0xff < uVar75),
                    (undefined2)local_1618);
      local_1618._0_4_ =
           CONCAT13((uVar79 != 0) * (uVar79 < 0x100) * (char)uVar79 - (0xff < uVar79),
                    (undefined3)local_1618);
      local_1618._0_5_ =
           CONCAT14((uVar83 != 0) * (uVar83 < 0x100) * (char)uVar83 - (0xff < uVar83),
                    (undefined4)local_1618);
      local_1618._0_6_ =
           CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87),
                    (undefined5)local_1618);
      local_1618._0_7_ =
           CONCAT16((uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91),
                    (undefined6)local_1618);
      local_1618 = CONCAT17((uVar95 != 0) * (uVar95 < 0x100) * (char)uVar95 - (0xff < uVar95),
                            (undefined7)local_1618);
      uStack_1610._0_1_ = (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55);
      uStack_1610._1_1_ = (uVar72 != 0) * (uVar72 < 0x100) * (char)uVar72 - (0xff < uVar72);
      uStack_1610._2_1_ = (uVar76 != 0) * (uVar76 < 0x100) * (char)uVar76 - (0xff < uVar76);
      uStack_1610._3_1_ = (uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 - (0xff < uVar80);
      uStack_1610._4_1_ = (uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84);
      uStack_1610._5_1_ = (uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88);
      uStack_1610._6_1_ = (uVar92 != 0) * (uVar92 < 0x100) * (char)uVar92 - (0xff < uVar92);
      uStack_1610._7_1_ = (uVar96 != 0) * (uVar96 < 0x100) * (char)uVar96 - (0xff < uVar96);
      local_1628._0_2_ =
           CONCAT11((uVar73 != 0) * (uVar73 < 0x100) * (char)uVar73 - (0xff < uVar73),
                    (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56));
      local_1628._0_3_ =
           CONCAT12((uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77),
                    (undefined2)local_1628);
      local_1628._0_4_ =
           CONCAT13((uVar81 != 0) * (uVar81 < 0x100) * (char)uVar81 - (0xff < uVar81),
                    (undefined3)local_1628);
      local_1628._0_5_ =
           CONCAT14((uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 - (0xff < uVar85),
                    (undefined4)local_1628);
      local_1628._0_6_ =
           CONCAT15((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89),
                    (undefined5)local_1628);
      local_1628._0_7_ =
           CONCAT16((uVar93 != 0) * (uVar93 < 0x100) * (char)uVar93 - (0xff < uVar93),
                    (undefined6)local_1628);
      local_1628 = CONCAT17((uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97),
                            (undefined7)local_1628);
      uStack_1620._0_1_ = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
      uStack_1620._1_1_ = (uVar74 != 0) * (uVar74 < 0x100) * (char)uVar74 - (0xff < uVar74);
      uStack_1620._2_1_ = (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
      uStack_1620._3_1_ = (uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82);
      uStack_1620._4_1_ = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
      uStack_1620._5_1_ = (uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 - (0xff < uVar90);
      uStack_1620._6_1_ = (uVar94 != 0) * (uVar94 < 0x100) * (char)uVar94 - (0xff < uVar94);
      uStack_1620._7_1_ = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
      puVar52 = (undefined8 *)(in_RDX + (int)(local_14b8 * in_ECX));
      *puVar52 = local_1618;
      puVar52[1] = uStack_1610;
      lVar53 = in_RDX + (int)(local_14b8 * in_ECX);
      *(undefined8 *)(lVar53 + 0x10) = local_1628;
      *(undefined8 *)(lVar53 + 0x18) = uStack_1620;
      local_1598._0_4_ = CONCAT22(sStack_786 + -0x100,local_788 + -0x100);
      local_1598._0_6_ = CONCAT24(sStack_784 + -0x100,(undefined4)local_1598);
      local_1598 = CONCAT26(sStack_782 + -0x100,(undefined6)local_1598);
      uStack_1590._0_4_ = CONCAT22(sStack_77e + -0x100,sStack_780 + -0x100);
      uStack_1590._0_6_ = CONCAT24(sStack_77c + -0x100,(undefined4)uStack_1590);
      uStack_1590 = CONCAT26(sStack_77a + -0x100,(undefined6)uStack_1590);
      local_15d8._0_4_ = CONCAT22(sStack_d96 + 0x100,local_d98 + 0x100);
      local_15d8._0_6_ = CONCAT24(sStack_d94 + 0x100,(undefined4)local_15d8);
      local_15d8 = CONCAT26(sStack_d92 + 0x100,(undefined6)local_15d8);
      uStack_15d0._0_4_ = CONCAT22(sStack_d8e + 0x100,sStack_d90 + 0x100);
      uStack_15d0._0_6_ = CONCAT24(sStack_d8c + 0x100,(undefined4)uStack_15d0);
      uStack_15d0 = CONCAT26(sStack_d8a + 0x100,(undefined6)uStack_15d0);
    }
  }
  else if (in_R8D == 0x10) {
    local_1598 = 0xf0c0f0d0f0e0f0f;
    uStack_1590 = 0xf080f090f0a0f0b;
    local_15d8 = 0x104010301020101;
    uStack_15d0 = 0x108010701060105;
    for (local_14b8 = 0; (int)local_14b8 < 0x10; local_14b8 = local_14b8 + 2) {
      uStack_16f0._0_1_ = *(undefined1 *)(in_RDI + (int)(~local_14b8 + iVar6));
      uStack_1700._0_1_ = *(undefined1 *)(in_RDI + (int)((iVar6 - local_14b8) + -2));
      local_808 = (short)local_1598;
      sStack_806 = (short)((ulong)local_1598 >> 0x10);
      sStack_804 = (short)((ulong)local_1598 >> 0x20);
      sStack_802 = (short)((ulong)local_1598 >> 0x30);
      sStack_800 = (short)uStack_1590;
      sStack_7fe = (short)((ulong)uStack_1590 >> 0x10);
      sStack_7fc = (short)((ulong)uStack_1590 >> 0x20);
      sStack_7fa = (short)((ulong)uStack_1590 >> 0x30);
      local_f18 = (short)local_15d8;
      sStack_f16 = (short)((ulong)local_15d8 >> 0x10);
      sStack_f14 = (short)((ulong)local_15d8 >> 0x20);
      sStack_f12 = (short)((ulong)local_15d8 >> 0x30);
      sStack_f10 = (short)uStack_15d0;
      sStack_f0e = (short)((ulong)uStack_15d0 >> 0x10);
      sStack_f0c = (short)((ulong)uStack_15d0 >> 0x20);
      sStack_f0a = (short)((ulong)uStack_15d0 >> 0x30);
      puVar52 = (undefined8 *)(in_RDI + 1 + (long)iVar6);
      uVar7 = *puVar52;
      uVar8 = puVar52[1];
      local_1308 = (undefined1)uVar7;
      uStack_1307 = (undefined1)((ulong)uVar7 >> 8);
      uStack_1306 = (undefined1)((ulong)uVar7 >> 0x10);
      uStack_1305 = (undefined1)((ulong)uVar7 >> 0x18);
      uStack_1304 = (undefined1)((ulong)uVar7 >> 0x20);
      uStack_1303 = (undefined1)((ulong)uVar7 >> 0x28);
      uStack_1302 = (undefined1)((ulong)uVar7 >> 0x30);
      uStack_1301 = (undefined1)((ulong)uVar7 >> 0x38);
      local_16f8._0_2_ = CONCAT11(local_1308,(undefined1)uStack_16f0);
      local_16f8._0_3_ = CONCAT12((undefined1)uStack_16f0,(undefined2)local_16f8);
      local_16f8._0_4_ = CONCAT13(uStack_1307,(undefined3)local_16f8);
      local_16f8._0_5_ = CONCAT14((undefined1)uStack_16f0,(undefined4)local_16f8);
      local_16f8._0_6_ = CONCAT15(uStack_1306,(undefined5)local_16f8);
      local_16f8._0_7_ = CONCAT16((undefined1)uStack_16f0,(undefined6)local_16f8);
      local_16f8 = CONCAT17(uStack_1305,(undefined7)local_16f8);
      uStack_16f0._1_1_ = uStack_1304;
      uStack_16f0._2_1_ = (undefined1)uStack_16f0;
      uStack_16f0._3_1_ = uStack_1303;
      uStack_16f0._4_1_ = (undefined1)uStack_16f0;
      uStack_16f0._5_1_ = uStack_1302;
      uStack_16f0._6_1_ = (undefined1)uStack_16f0;
      uStack_16f0._7_1_ = uStack_1301;
      local_1708._0_2_ = CONCAT11(local_1308,(undefined1)uStack_1700);
      local_1708._0_3_ = CONCAT12((undefined1)uStack_1700,(undefined2)local_1708);
      local_1708._0_4_ = CONCAT13(uStack_1307,(undefined3)local_1708);
      local_1708._0_5_ = CONCAT14((undefined1)uStack_1700,(undefined4)local_1708);
      local_1708._0_6_ = CONCAT15(uStack_1306,(undefined5)local_1708);
      local_1708._0_7_ = CONCAT16((undefined1)uStack_1700,(undefined6)local_1708);
      local_1708 = CONCAT17(uStack_1305,(undefined7)local_1708);
      uStack_1700._1_1_ = uStack_1304;
      uStack_1700._2_1_ = (undefined1)uStack_1700;
      uStack_1700._3_1_ = uStack_1303;
      uStack_1700._4_1_ = (undefined1)uStack_1700;
      uStack_1700._5_1_ = uStack_1302;
      uStack_1700._6_1_ = (undefined1)uStack_1700;
      uStack_1700._7_1_ = uStack_1301;
      uStack_750 = (undefined1)uVar8;
      uStack_74f = (undefined1)((ulong)uVar8 >> 8);
      uStack_74e = (undefined1)((ulong)uVar8 >> 0x10);
      uStack_74d = (undefined1)((ulong)uVar8 >> 0x18);
      uStack_74c = (undefined1)((ulong)uVar8 >> 0x20);
      uStack_74b = (undefined1)((ulong)uVar8 >> 0x28);
      uStack_74a = (undefined1)((ulong)uVar8 >> 0x30);
      uStack_749 = (undefined1)((ulong)uVar8 >> 0x38);
      local_1718._0_2_ = CONCAT11(uStack_750,(undefined1)uStack_16f0);
      local_1718._0_3_ = CONCAT12((undefined1)uStack_16f0,(undefined2)local_1718);
      local_1718._0_4_ = CONCAT13(uStack_74f,(undefined3)local_1718);
      local_1718._0_5_ = CONCAT14((undefined1)uStack_16f0,(undefined4)local_1718);
      local_1718._0_6_ = CONCAT15(uStack_74e,(undefined5)local_1718);
      local_1718._0_7_ = CONCAT16((undefined1)uStack_16f0,(undefined6)local_1718);
      local_1718 = CONCAT17(uStack_74d,(undefined7)local_1718);
      uStack_1710._0_1_ = (undefined1)uStack_16f0;
      uStack_1710._1_1_ = uStack_74c;
      uStack_1710._2_1_ = (undefined1)uStack_16f0;
      uStack_1710._3_1_ = uStack_74b;
      uStack_1710._4_1_ = (undefined1)uStack_16f0;
      uStack_1710._5_1_ = uStack_74a;
      uStack_1710._6_1_ = (undefined1)uStack_16f0;
      uStack_1710._7_1_ = uStack_749;
      local_1728._0_2_ = CONCAT11(uStack_750,(undefined1)uStack_1700);
      local_1728._0_3_ = CONCAT12((undefined1)uStack_1700,(undefined2)local_1728);
      local_1728._0_4_ = CONCAT13(uStack_74f,(undefined3)local_1728);
      local_1728._0_5_ = CONCAT14((undefined1)uStack_1700,(undefined4)local_1728);
      local_1728._0_6_ = CONCAT15(uStack_74e,(undefined5)local_1728);
      local_1728._0_7_ = CONCAT16((undefined1)uStack_1700,(undefined6)local_1728);
      local_1728 = CONCAT17(uStack_74d,(undefined7)local_1728);
      uStack_1720._0_1_ = (undefined1)uStack_1700;
      uStack_1720._1_1_ = uStack_74c;
      uStack_1720._2_1_ = (undefined1)uStack_1700;
      uStack_1720._3_1_ = uStack_74b;
      uStack_1720._4_1_ = (undefined1)uStack_1700;
      uStack_1720._5_1_ = uStack_74a;
      uStack_1720._6_1_ = (undefined1)uStack_1700;
      uStack_1720._7_1_ = uStack_749;
      auVar32._8_8_ = uVar5;
      auVar32._0_8_ = uVar4;
      auVar31._8_8_ = uStack_15d0;
      auVar31._0_8_ = local_15d8;
      auVar59 = pmaddubsw(auVar32,auVar31);
      auVar29._2_2_ = sStack_f16 + 0x100;
      auVar29._0_2_ = local_f18 + 0x100;
      auVar29._4_2_ = sStack_f14 + 0x100;
      auVar29._6_2_ = sStack_f12 + 0x100;
      auVar29._10_2_ = sStack_f0e + 0x100;
      auVar29._8_2_ = sStack_f10 + 0x100;
      auVar29._12_2_ = sStack_f0c + 0x100;
      auVar29._14_2_ = sStack_f0a + 0x100;
      auVar30._8_8_ = uVar5;
      auVar30._0_8_ = uVar4;
      auVar60 = pmaddubsw(auVar30,auVar29);
      auVar27._2_2_ = sStack_f16 + 8;
      auVar27._0_2_ = local_f18 + 8;
      auVar27._4_2_ = sStack_f14 + 8;
      auVar27._6_2_ = sStack_f12 + 8;
      auVar27._10_2_ = sStack_f0e + 8;
      auVar27._8_2_ = sStack_f10 + 8;
      auVar27._12_2_ = sStack_f0c + 8;
      auVar27._14_2_ = sStack_f0a + 8;
      auVar28._8_8_ = uVar5;
      auVar28._0_8_ = uVar4;
      auVar61 = pmaddubsw(auVar28,auVar27);
      auVar25._2_2_ = sStack_f16 + 0x108;
      auVar25._0_2_ = local_f18 + 0x108;
      auVar25._4_2_ = sStack_f14 + 0x108;
      auVar25._6_2_ = sStack_f12 + 0x108;
      auVar25._10_2_ = sStack_f0e + 0x108;
      auVar25._8_2_ = sStack_f10 + 0x108;
      auVar25._12_2_ = sStack_f0c + 0x108;
      auVar25._14_2_ = sStack_f0a + 0x108;
      auVar26._8_8_ = uVar5;
      auVar26._0_8_ = uVar4;
      auVar62 = pmaddubsw(auVar26,auVar25);
      auVar24._8_8_ = uStack_16f0;
      auVar24._0_8_ = local_16f8;
      auVar23._8_8_ = uStack_1590;
      auVar23._0_8_ = local_1598;
      auVar63 = pmaddubsw(auVar24,auVar23);
      auVar21._2_2_ = sStack_806 + -0x100;
      auVar21._0_2_ = local_808 + -0x100;
      auVar21._4_2_ = sStack_804 + -0x100;
      auVar21._6_2_ = sStack_802 + -0x100;
      auVar21._10_2_ = sStack_7fe + -0x100;
      auVar21._8_2_ = sStack_800 + -0x100;
      auVar21._12_2_ = sStack_7fc + -0x100;
      auVar21._14_2_ = sStack_7fa + -0x100;
      auVar22._8_8_ = uStack_1700;
      auVar22._0_8_ = local_1708;
      auVar64 = pmaddubsw(auVar22,auVar21);
      auVar19._2_2_ = sStack_806 + -8;
      auVar19._0_2_ = local_808 + -8;
      auVar19._4_2_ = sStack_804 + -8;
      auVar19._6_2_ = sStack_802 + -8;
      auVar19._10_2_ = sStack_7fe + -8;
      auVar19._8_2_ = sStack_800 + -8;
      auVar19._12_2_ = sStack_7fc + -8;
      auVar19._14_2_ = sStack_7fa + -8;
      auVar20._8_8_ = uStack_1710;
      auVar20._0_8_ = local_1718;
      auVar65 = pmaddubsw(auVar20,auVar19);
      auVar17._2_2_ = sStack_806 + -0x108;
      auVar17._0_2_ = local_808 + -0x108;
      auVar17._4_2_ = sStack_804 + -0x108;
      auVar17._6_2_ = sStack_802 + -0x108;
      auVar17._10_2_ = sStack_7fe + -0x108;
      auVar17._8_2_ = sStack_800 + -0x108;
      auVar17._12_2_ = sStack_7fc + -0x108;
      auVar17._14_2_ = sStack_7fa + -0x108;
      auVar18._8_8_ = uStack_1720;
      auVar18._0_8_ = local_1728;
      auVar66 = pmaddubsw(auVar18,auVar17);
      local_f78 = auVar59._0_2_;
      sStack_f76 = auVar59._2_2_;
      sStack_f74 = auVar59._4_2_;
      sStack_f72 = auVar59._6_2_;
      sStack_f70 = auVar59._8_2_;
      sStack_f6e = auVar59._10_2_;
      sStack_f6c = auVar59._12_2_;
      sStack_f6a = auVar59._14_2_;
      local_f88 = auVar63._0_2_;
      sStack_f86 = auVar63._2_2_;
      sStack_f84 = auVar63._4_2_;
      sStack_f82 = auVar63._6_2_;
      sStack_f80 = auVar63._8_2_;
      sStack_f7e = auVar63._10_2_;
      sStack_f7c = auVar63._12_2_;
      sStack_f7a = auVar63._14_2_;
      local_f98 = auVar60._0_2_;
      sStack_f96 = auVar60._2_2_;
      sStack_f94 = auVar60._4_2_;
      sStack_f92 = auVar60._6_2_;
      sStack_f90 = auVar60._8_2_;
      sStack_f8e = auVar60._10_2_;
      sStack_f8c = auVar60._12_2_;
      sStack_f8a = auVar60._14_2_;
      local_fa8 = auVar64._0_2_;
      sStack_fa6 = auVar64._2_2_;
      sStack_fa4 = auVar64._4_2_;
      sStack_fa2 = auVar64._6_2_;
      sStack_fa0 = auVar64._8_2_;
      sStack_f9e = auVar64._10_2_;
      sStack_f9c = auVar64._12_2_;
      sStack_f9a = auVar64._14_2_;
      local_fb8 = auVar61._0_2_;
      sStack_fb6 = auVar61._2_2_;
      sStack_fb4 = auVar61._4_2_;
      sStack_fb2 = auVar61._6_2_;
      sStack_fb0 = auVar61._8_2_;
      sStack_fae = auVar61._10_2_;
      sStack_fac = auVar61._12_2_;
      sStack_faa = auVar61._14_2_;
      local_fc8 = auVar65._0_2_;
      sStack_fc6 = auVar65._2_2_;
      sStack_fc4 = auVar65._4_2_;
      sStack_fc2 = auVar65._6_2_;
      sStack_fc0 = auVar65._8_2_;
      sStack_fbe = auVar65._10_2_;
      sStack_fbc = auVar65._12_2_;
      sStack_fba = auVar65._14_2_;
      local_fd8 = auVar62._0_2_;
      sStack_fd6 = auVar62._2_2_;
      sStack_fd4 = auVar62._4_2_;
      sStack_fd2 = auVar62._6_2_;
      sStack_fd0 = auVar62._8_2_;
      sStack_fce = auVar62._10_2_;
      sStack_fcc = auVar62._12_2_;
      sStack_fca = auVar62._14_2_;
      local_fe8 = auVar66._0_2_;
      sStack_fe6 = auVar66._2_2_;
      sStack_fe4 = auVar66._4_2_;
      sStack_fe2 = auVar66._6_2_;
      sStack_fe0 = auVar66._8_2_;
      sStack_fde = auVar66._10_2_;
      sStack_fdc = auVar66._12_2_;
      sStack_fda = auVar66._14_2_;
      uVar54 = (ushort)(local_f78 + local_f88 + local_14b0) >> 5;
      uVar71 = (ushort)(sStack_f76 + sStack_f86 + local_14b0) >> 5;
      uVar75 = (ushort)(sStack_f74 + sStack_f84 + local_14b0) >> 5;
      uVar79 = (ushort)(sStack_f72 + sStack_f82 + local_14b0) >> 5;
      uVar83 = (ushort)(sStack_f70 + sStack_f80 + local_14b0) >> 5;
      uVar87 = (ushort)(sStack_f6e + sStack_f7e + local_14b0) >> 5;
      uVar91 = (ushort)(sStack_f6c + sStack_f7c + local_14b0) >> 5;
      uVar95 = (ushort)(sStack_f6a + sStack_f7a + local_14b0) >> 5;
      uVar55 = (ushort)(local_f98 + local_fa8 + local_14b0) >> 5;
      uVar72 = (ushort)(sStack_f96 + sStack_fa6 + local_14b0) >> 5;
      uVar76 = (ushort)(sStack_f94 + sStack_fa4 + local_14b0) >> 5;
      uVar80 = (ushort)(sStack_f92 + sStack_fa2 + local_14b0) >> 5;
      uVar84 = (ushort)(sStack_f90 + sStack_fa0 + local_14b0) >> 5;
      uVar88 = (ushort)(sStack_f8e + sStack_f9e + local_14b0) >> 5;
      uVar92 = (ushort)(sStack_f8c + sStack_f9c + local_14b0) >> 5;
      uVar96 = (ushort)(sStack_f8a + sStack_f9a + local_14b0) >> 5;
      uVar56 = (ushort)(local_fb8 + local_fc8 + local_14b0) >> 5;
      uVar73 = (ushort)(sStack_fb6 + sStack_fc6 + local_14b0) >> 5;
      uVar77 = (ushort)(sStack_fb4 + sStack_fc4 + local_14b0) >> 5;
      uVar81 = (ushort)(sStack_fb2 + sStack_fc2 + local_14b0) >> 5;
      uVar85 = (ushort)(sStack_fb0 + sStack_fc0 + local_14b0) >> 5;
      uVar89 = (ushort)(sStack_fae + sStack_fbe + local_14b0) >> 5;
      uVar93 = (ushort)(sStack_fac + sStack_fbc + local_14b0) >> 5;
      uVar97 = (ushort)(sStack_faa + sStack_fba + local_14b0) >> 5;
      uVar57 = (ushort)(local_fd8 + local_fe8 + local_14b0) >> 5;
      uVar74 = (ushort)(sStack_fd6 + sStack_fe6 + local_14b0) >> 5;
      uVar78 = (ushort)(sStack_fd4 + sStack_fe4 + local_14b0) >> 5;
      uVar82 = (ushort)(sStack_fd2 + sStack_fe2 + local_14b0) >> 5;
      uVar86 = (ushort)(sStack_fd0 + sStack_fe0 + local_14b0) >> 5;
      uVar90 = (ushort)(sStack_fce + sStack_fde + local_14b0) >> 5;
      uVar94 = (ushort)(sStack_fcc + sStack_fdc + local_14b0) >> 5;
      uVar98 = (ushort)(sStack_fca + sStack_fda + local_14b0) >> 5;
      local_16b8._0_2_ =
           CONCAT11((uVar71 != 0) * (uVar71 < 0x100) * (char)uVar71 - (0xff < uVar71),
                    (uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 - (0xff < uVar54));
      local_16b8._0_3_ =
           CONCAT12((uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 - (0xff < uVar75),
                    (undefined2)local_16b8);
      local_16b8._0_4_ =
           CONCAT13((uVar79 != 0) * (uVar79 < 0x100) * (char)uVar79 - (0xff < uVar79),
                    (undefined3)local_16b8);
      local_16b8._0_5_ =
           CONCAT14((uVar83 != 0) * (uVar83 < 0x100) * (char)uVar83 - (0xff < uVar83),
                    (undefined4)local_16b8);
      local_16b8._0_6_ =
           CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 - (0xff < uVar87),
                    (undefined5)local_16b8);
      local_16b8._0_7_ =
           CONCAT16((uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91),
                    (undefined6)local_16b8);
      local_16b8 = CONCAT17((uVar95 != 0) * (uVar95 < 0x100) * (char)uVar95 - (0xff < uVar95),
                            (undefined7)local_16b8);
      uStack_16b0._0_1_ = (uVar56 != 0) * (uVar56 < 0x100) * (char)uVar56 - (0xff < uVar56);
      uStack_16b0._1_1_ = (uVar73 != 0) * (uVar73 < 0x100) * (char)uVar73 - (0xff < uVar73);
      uStack_16b0._2_1_ = (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77);
      uStack_16b0._3_1_ = (uVar81 != 0) * (uVar81 < 0x100) * (char)uVar81 - (0xff < uVar81);
      uStack_16b0._4_1_ = (uVar85 != 0) * (uVar85 < 0x100) * (char)uVar85 - (0xff < uVar85);
      uStack_16b0._5_1_ = (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 - (0xff < uVar89);
      uStack_16b0._6_1_ = (uVar93 != 0) * (uVar93 < 0x100) * (char)uVar93 - (0xff < uVar93);
      uStack_16b0._7_1_ = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
      local_16c8._0_2_ =
           CONCAT11((uVar72 != 0) * (uVar72 < 0x100) * (char)uVar72 - (0xff < uVar72),
                    (uVar55 != 0) * (uVar55 < 0x100) * (char)uVar55 - (0xff < uVar55));
      local_16c8._0_3_ =
           CONCAT12((uVar76 != 0) * (uVar76 < 0x100) * (char)uVar76 - (0xff < uVar76),
                    (undefined2)local_16c8);
      local_16c8._0_4_ =
           CONCAT13((uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 - (0xff < uVar80),
                    (undefined3)local_16c8);
      local_16c8._0_5_ =
           CONCAT14((uVar84 != 0) * (uVar84 < 0x100) * (char)uVar84 - (0xff < uVar84),
                    (undefined4)local_16c8);
      local_16c8._0_6_ =
           CONCAT15((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 - (0xff < uVar88),
                    (undefined5)local_16c8);
      local_16c8._0_7_ =
           CONCAT16((uVar92 != 0) * (uVar92 < 0x100) * (char)uVar92 - (0xff < uVar92),
                    (undefined6)local_16c8);
      local_16c8 = CONCAT17((uVar96 != 0) * (uVar96 < 0x100) * (char)uVar96 - (0xff < uVar96),
                            (undefined7)local_16c8);
      uStack_16c0._0_1_ = (uVar57 != 0) * (uVar57 < 0x100) * (char)uVar57 - (0xff < uVar57);
      uStack_16c0._1_1_ = (uVar74 != 0) * (uVar74 < 0x100) * (char)uVar74 - (0xff < uVar74);
      uStack_16c0._2_1_ = (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
      uStack_16c0._3_1_ = (uVar82 != 0) * (uVar82 < 0x100) * (char)uVar82 - (0xff < uVar82);
      uStack_16c0._4_1_ = (uVar86 != 0) * (uVar86 < 0x100) * (char)uVar86 - (0xff < uVar86);
      uStack_16c0._5_1_ = (uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 - (0xff < uVar90);
      uStack_16c0._6_1_ = (uVar94 != 0) * (uVar94 < 0x100) * (char)uVar94 - (0xff < uVar94);
      uStack_16c0._7_1_ = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
      puVar52 = (undefined8 *)(in_RDX + (int)(local_14b8 * in_ECX));
      *puVar52 = local_16b8;
      puVar52[1] = uStack_16b0;
      puVar52 = (undefined8 *)(in_RDX + (int)((local_14b8 + 1) * in_ECX));
      *puVar52 = local_16c8;
      puVar52[1] = uStack_16c0;
      local_1598._0_4_ = CONCAT22(sStack_806 + -0x200,local_808 + -0x200);
      local_1598._0_6_ = CONCAT24(sStack_804 + -0x200,(undefined4)local_1598);
      local_1598 = CONCAT26(sStack_802 + -0x200,(undefined6)local_1598);
      uStack_1590._0_4_ = CONCAT22(sStack_7fe + -0x200,sStack_800 + -0x200);
      uStack_1590._0_6_ = CONCAT24(sStack_7fc + -0x200,(undefined4)uStack_1590);
      uStack_1590 = CONCAT26(sStack_7fa + -0x200,(undefined6)uStack_1590);
      local_15d8._0_4_ = CONCAT22(sStack_f16 + 0x200,local_f18 + 0x200);
      local_15d8._0_6_ = CONCAT24(sStack_f14 + 0x200,(undefined4)local_15d8);
      local_15d8 = CONCAT26(sStack_f12 + 0x200,(undefined6)local_15d8);
      uStack_15d0._0_4_ = CONCAT22(sStack_f0e + 0x200,sStack_f10 + 0x200);
      uStack_15d0._0_6_ = CONCAT24(sStack_f0c + 0x200,(undefined4)uStack_15d0);
      uStack_15d0 = CONCAT26(sStack_f0a + 0x200,(undefined6)uStack_15d0);
    }
  }
  else if (in_R8D == 8) {
    local_1598 = 0x704070507060707;
    uStack_1590 = 0x700070107020703;
    local_15d8 = 0x104010301020101;
    uStack_15d0 = 0x108010701060105;
    for (local_14b8 = 0; (int)local_14b8 < 8; local_14b8 = local_14b8 + 4) {
      uStack_1780._0_1_ = *(undefined1 *)(in_RDI + (int)(~local_14b8 + iVar6));
      uStack_1790._0_1_ = *(undefined1 *)(in_RDI + (int)((iVar6 - local_14b8) + -2));
      uStack_17a0._0_1_ = *(undefined1 *)(in_RDI + (int)((iVar6 - local_14b8) + -3));
      uStack_17b0._0_1_ = *(undefined1 *)(in_RDI + (int)((iVar6 - local_14b8) + -4));
      local_888 = (short)local_1598;
      sStack_886 = (short)((ulong)local_1598 >> 0x10);
      sStack_884 = (short)((ulong)local_1598 >> 0x20);
      sStack_882 = (short)((ulong)local_1598 >> 0x30);
      sStack_880 = (short)uStack_1590;
      sStack_87e = (short)((ulong)uStack_1590 >> 0x10);
      sStack_87c = (short)((ulong)uStack_1590 >> 0x20);
      sStack_87a = (short)((ulong)uStack_1590 >> 0x30);
      local_1098 = (short)local_15d8;
      sStack_1096 = (short)((ulong)local_15d8 >> 0x10);
      sStack_1094 = (short)((ulong)local_15d8 >> 0x20);
      sStack_1092 = (short)((ulong)local_15d8 >> 0x30);
      sStack_1090 = (short)uStack_15d0;
      sStack_108e = (short)((ulong)uStack_15d0 >> 0x10);
      sStack_108c = (short)((ulong)uStack_15d0 >> 0x20);
      sStack_108a = (short)((ulong)uStack_15d0 >> 0x30);
      uVar7 = *(undefined8 *)(in_RDI + 1 + (long)iVar6);
      local_1348 = (undefined1)uVar7;
      uStack_1347 = (undefined1)((ulong)uVar7 >> 8);
      uStack_1346 = (undefined1)((ulong)uVar7 >> 0x10);
      uStack_1345 = (undefined1)((ulong)uVar7 >> 0x18);
      uStack_1344 = (undefined1)((ulong)uVar7 >> 0x20);
      uStack_1343 = (undefined1)((ulong)uVar7 >> 0x28);
      uStack_1342 = (undefined1)((ulong)uVar7 >> 0x30);
      uStack_1341 = (undefined1)((ulong)uVar7 >> 0x38);
      local_1788._0_2_ = CONCAT11(local_1348,(undefined1)uStack_1780);
      local_1788._0_3_ = CONCAT12((undefined1)uStack_1780,(undefined2)local_1788);
      local_1788._0_4_ = CONCAT13(uStack_1347,(undefined3)local_1788);
      local_1788._0_5_ = CONCAT14((undefined1)uStack_1780,(undefined4)local_1788);
      local_1788._0_6_ = CONCAT15(uStack_1346,(undefined5)local_1788);
      local_1788._0_7_ = CONCAT16((undefined1)uStack_1780,(undefined6)local_1788);
      local_1788 = CONCAT17(uStack_1345,(undefined7)local_1788);
      uStack_1780._1_1_ = uStack_1344;
      uStack_1780._2_1_ = (undefined1)uStack_1780;
      uStack_1780._3_1_ = uStack_1343;
      uStack_1780._4_1_ = (undefined1)uStack_1780;
      uStack_1780._5_1_ = uStack_1342;
      uStack_1780._6_1_ = (undefined1)uStack_1780;
      uStack_1780._7_1_ = uStack_1341;
      local_1798._0_2_ = CONCAT11(local_1348,(undefined1)uStack_1790);
      local_1798._0_3_ = CONCAT12((undefined1)uStack_1790,(undefined2)local_1798);
      local_1798._0_4_ = CONCAT13(uStack_1347,(undefined3)local_1798);
      local_1798._0_5_ = CONCAT14((undefined1)uStack_1790,(undefined4)local_1798);
      local_1798._0_6_ = CONCAT15(uStack_1346,(undefined5)local_1798);
      local_1798._0_7_ = CONCAT16((undefined1)uStack_1790,(undefined6)local_1798);
      local_1798 = CONCAT17(uStack_1345,(undefined7)local_1798);
      uStack_1790._1_1_ = uStack_1344;
      uStack_1790._2_1_ = (undefined1)uStack_1790;
      uStack_1790._3_1_ = uStack_1343;
      uStack_1790._4_1_ = (undefined1)uStack_1790;
      uStack_1790._5_1_ = uStack_1342;
      uStack_1790._6_1_ = (undefined1)uStack_1790;
      uStack_1790._7_1_ = uStack_1341;
      local_17a8._0_2_ = CONCAT11(local_1348,(undefined1)uStack_17a0);
      local_17a8._0_3_ = CONCAT12((undefined1)uStack_17a0,(undefined2)local_17a8);
      local_17a8._0_4_ = CONCAT13(uStack_1347,(undefined3)local_17a8);
      local_17a8._0_5_ = CONCAT14((undefined1)uStack_17a0,(undefined4)local_17a8);
      local_17a8._0_6_ = CONCAT15(uStack_1346,(undefined5)local_17a8);
      local_17a8._0_7_ = CONCAT16((undefined1)uStack_17a0,(undefined6)local_17a8);
      local_17a8 = CONCAT17(uStack_1345,(undefined7)local_17a8);
      uStack_17a0._1_1_ = uStack_1344;
      uStack_17a0._2_1_ = (undefined1)uStack_17a0;
      uStack_17a0._3_1_ = uStack_1343;
      uStack_17a0._4_1_ = (undefined1)uStack_17a0;
      uStack_17a0._5_1_ = uStack_1342;
      uStack_17a0._6_1_ = (undefined1)uStack_17a0;
      uStack_17a0._7_1_ = uStack_1341;
      local_17b8._0_2_ = CONCAT11(local_1348,(undefined1)uStack_17b0);
      local_17b8._0_3_ = CONCAT12((undefined1)uStack_17b0,(undefined2)local_17b8);
      local_17b8._0_4_ = CONCAT13(uStack_1347,(undefined3)local_17b8);
      local_17b8._0_5_ = CONCAT14((undefined1)uStack_17b0,(undefined4)local_17b8);
      local_17b8._0_6_ = CONCAT15(uStack_1346,(undefined5)local_17b8);
      local_17b8._0_7_ = CONCAT16((undefined1)uStack_17b0,(undefined6)local_17b8);
      local_17b8 = CONCAT17(uStack_1345,(undefined7)local_17b8);
      uStack_17b0._1_1_ = uStack_1344;
      uStack_17b0._2_1_ = (undefined1)uStack_17b0;
      uStack_17b0._3_1_ = uStack_1343;
      uStack_17b0._4_1_ = (undefined1)uStack_17b0;
      uStack_17b0._5_1_ = uStack_1342;
      uStack_17b0._6_1_ = (undefined1)uStack_17b0;
      uStack_17b0._7_1_ = uStack_1341;
      auVar16._8_8_ = uVar5;
      auVar16._0_8_ = uVar4;
      auVar67._8_8_ = uStack_15d0;
      auVar67._0_8_ = local_15d8;
      auVar67 = pmaddubsw(auVar16,auVar67);
      auVar68._2_2_ = sStack_1096 + 0x100;
      auVar68._0_2_ = local_1098 + 0x100;
      auVar68._4_2_ = sStack_1094 + 0x100;
      auVar68._6_2_ = sStack_1092 + 0x100;
      auVar68._10_2_ = sStack_108e + 0x100;
      auVar68._8_2_ = sStack_1090 + 0x100;
      auVar68._12_2_ = sStack_108c + 0x100;
      auVar68._14_2_ = sStack_108a + 0x100;
      auVar15._8_8_ = uVar5;
      auVar15._0_8_ = uVar4;
      auVar68 = pmaddubsw(auVar15,auVar68);
      auVar69._2_2_ = sStack_1096 + 0x200;
      auVar69._0_2_ = local_1098 + 0x200;
      auVar69._4_2_ = sStack_1094 + 0x200;
      auVar69._6_2_ = sStack_1092 + 0x200;
      auVar69._10_2_ = sStack_108e + 0x200;
      auVar69._8_2_ = sStack_1090 + 0x200;
      auVar69._12_2_ = sStack_108c + 0x200;
      auVar69._14_2_ = sStack_108a + 0x200;
      auVar14._8_8_ = uVar5;
      auVar14._0_8_ = uVar4;
      auVar69 = pmaddubsw(auVar14,auVar69);
      auVar70._2_2_ = sStack_1096 + 0x300;
      auVar70._0_2_ = local_1098 + 0x300;
      auVar70._4_2_ = sStack_1094 + 0x300;
      auVar70._6_2_ = sStack_1092 + 0x300;
      auVar70._10_2_ = sStack_108e + 0x300;
      auVar70._8_2_ = sStack_1090 + 0x300;
      auVar70._12_2_ = sStack_108c + 0x300;
      auVar70._14_2_ = sStack_108a + 0x300;
      auVar13._8_8_ = uVar5;
      auVar13._0_8_ = uVar4;
      auVar70 = pmaddubsw(auVar13,auVar70);
      auVar66._8_8_ = uStack_1780;
      auVar66._0_8_ = local_1788;
      auVar65._8_8_ = uStack_1590;
      auVar65._0_8_ = local_1598;
      auVar65 = pmaddubsw(auVar66,auVar65);
      auVar63._2_2_ = sStack_886 + -0x100;
      auVar63._0_2_ = local_888 + -0x100;
      auVar63._4_2_ = sStack_884 + -0x100;
      auVar63._6_2_ = sStack_882 + -0x100;
      auVar63._10_2_ = sStack_87e + -0x100;
      auVar63._8_2_ = sStack_880 + -0x100;
      auVar63._12_2_ = sStack_87c + -0x100;
      auVar63._14_2_ = sStack_87a + -0x100;
      auVar64._8_8_ = uStack_1790;
      auVar64._0_8_ = local_1798;
      auVar63 = pmaddubsw(auVar64,auVar63);
      auVar61._2_2_ = sStack_886 + -0x200;
      auVar61._0_2_ = local_888 + -0x200;
      auVar61._4_2_ = sStack_884 + -0x200;
      auVar61._6_2_ = sStack_882 + -0x200;
      auVar61._10_2_ = sStack_87e + -0x200;
      auVar61._8_2_ = sStack_880 + -0x200;
      auVar61._12_2_ = sStack_87c + -0x200;
      auVar61._14_2_ = sStack_87a + -0x200;
      auVar62._8_8_ = uStack_17a0;
      auVar62._0_8_ = local_17a8;
      auVar61 = pmaddubsw(auVar62,auVar61);
      auVar59._2_2_ = sStack_886 + -0x300;
      auVar59._0_2_ = local_888 + -0x300;
      auVar59._4_2_ = sStack_884 + -0x300;
      auVar59._6_2_ = sStack_882 + -0x300;
      auVar59._10_2_ = sStack_87e + -0x300;
      auVar59._8_2_ = sStack_880 + -0x300;
      auVar59._12_2_ = sStack_87c + -0x300;
      auVar59._14_2_ = sStack_87a + -0x300;
      auVar60._8_8_ = uStack_17b0;
      auVar60._0_8_ = local_17b8;
      auVar59 = pmaddubsw(auVar60,auVar59);
      local_10f8 = auVar67._0_2_;
      sStack_10f6 = auVar67._2_2_;
      sStack_10f4 = auVar67._4_2_;
      sStack_10f2 = auVar67._6_2_;
      sStack_10f0 = auVar67._8_2_;
      sStack_10ee = auVar67._10_2_;
      sStack_10ec = auVar67._12_2_;
      sStack_10ea = auVar67._14_2_;
      local_1108 = auVar65._0_2_;
      sStack_1106 = auVar65._2_2_;
      sStack_1104 = auVar65._4_2_;
      sStack_1102 = auVar65._6_2_;
      sStack_1100 = auVar65._8_2_;
      sStack_10fe = auVar65._10_2_;
      sStack_10fc = auVar65._12_2_;
      sStack_10fa = auVar65._14_2_;
      local_1118 = auVar68._0_2_;
      sStack_1116 = auVar68._2_2_;
      sStack_1114 = auVar68._4_2_;
      sStack_1112 = auVar68._6_2_;
      sStack_1110 = auVar68._8_2_;
      sStack_110e = auVar68._10_2_;
      sStack_110c = auVar68._12_2_;
      sStack_110a = auVar68._14_2_;
      local_1128 = auVar63._0_2_;
      sStack_1126 = auVar63._2_2_;
      sStack_1124 = auVar63._4_2_;
      sStack_1122 = auVar63._6_2_;
      sStack_1120 = auVar63._8_2_;
      sStack_111e = auVar63._10_2_;
      sStack_111c = auVar63._12_2_;
      sStack_111a = auVar63._14_2_;
      local_1138 = auVar69._0_2_;
      sStack_1136 = auVar69._2_2_;
      sStack_1134 = auVar69._4_2_;
      sStack_1132 = auVar69._6_2_;
      sStack_1130 = auVar69._8_2_;
      sStack_112e = auVar69._10_2_;
      sStack_112c = auVar69._12_2_;
      sStack_112a = auVar69._14_2_;
      local_1148 = auVar61._0_2_;
      sStack_1146 = auVar61._2_2_;
      sStack_1144 = auVar61._4_2_;
      sStack_1142 = auVar61._6_2_;
      sStack_1140 = auVar61._8_2_;
      sStack_113e = auVar61._10_2_;
      sStack_113c = auVar61._12_2_;
      sStack_113a = auVar61._14_2_;
      local_1158 = auVar70._0_2_;
      sStack_1156 = auVar70._2_2_;
      sStack_1154 = auVar70._4_2_;
      sStack_1152 = auVar70._6_2_;
      sStack_1150 = auVar70._8_2_;
      sStack_114e = auVar70._10_2_;
      sStack_114c = auVar70._12_2_;
      sStack_114a = auVar70._14_2_;
      local_1168 = auVar59._0_2_;
      sStack_1166 = auVar59._2_2_;
      sStack_1164 = auVar59._4_2_;
      sStack_1162 = auVar59._6_2_;
      sStack_1160 = auVar59._8_2_;
      sStack_115e = auVar59._10_2_;
      sStack_115c = auVar59._12_2_;
      sStack_115a = auVar59._14_2_;
      uVar54 = (ushort)(local_10f8 + local_1108 + local_14b0) >> 4;
      uVar71 = (ushort)(sStack_10f6 + sStack_1106 + local_14b0) >> 4;
      uVar75 = (ushort)(sStack_10f4 + sStack_1104 + local_14b0) >> 4;
      uVar79 = (ushort)(sStack_10f2 + sStack_1102 + local_14b0) >> 4;
      uVar83 = (ushort)(sStack_10f0 + sStack_1100 + local_14b0) >> 4;
      uVar87 = (ushort)(sStack_10ee + sStack_10fe + local_14b0) >> 4;
      uVar91 = (ushort)(sStack_10ec + sStack_10fc + local_14b0) >> 4;
      uVar95 = (ushort)(sStack_10ea + sStack_10fa + local_14b0) >> 4;
      uVar55 = (ushort)(local_1118 + local_1128 + local_14b0) >> 4;
      uVar72 = (ushort)(sStack_1116 + sStack_1126 + local_14b0) >> 4;
      uVar76 = (ushort)(sStack_1114 + sStack_1124 + local_14b0) >> 4;
      uVar80 = (ushort)(sStack_1112 + sStack_1122 + local_14b0) >> 4;
      uVar84 = (ushort)(sStack_1110 + sStack_1120 + local_14b0) >> 4;
      uVar88 = (ushort)(sStack_110e + sStack_111e + local_14b0) >> 4;
      uVar92 = (ushort)(sStack_110c + sStack_111c + local_14b0) >> 4;
      uVar96 = (ushort)(sStack_110a + sStack_111a + local_14b0) >> 4;
      uVar56 = (ushort)(local_1138 + local_1148 + local_14b0) >> 4;
      uVar73 = (ushort)(sStack_1136 + sStack_1146 + local_14b0) >> 4;
      uVar77 = (ushort)(sStack_1134 + sStack_1144 + local_14b0) >> 4;
      uVar81 = (ushort)(sStack_1132 + sStack_1142 + local_14b0) >> 4;
      uVar85 = (ushort)(sStack_1130 + sStack_1140 + local_14b0) >> 4;
      uVar89 = (ushort)(sStack_112e + sStack_113e + local_14b0) >> 4;
      uVar93 = (ushort)(sStack_112c + sStack_113c + local_14b0) >> 4;
      uVar97 = (ushort)(sStack_112a + sStack_113a + local_14b0) >> 4;
      uVar57 = (ushort)(local_1158 + local_1168 + local_14b0) >> 4;
      uVar74 = (ushort)(sStack_1156 + sStack_1166 + local_14b0) >> 4;
      uVar78 = (ushort)(sStack_1154 + sStack_1164 + local_14b0) >> 4;
      uVar82 = (ushort)(sStack_1152 + sStack_1162 + local_14b0) >> 4;
      uVar86 = (ushort)(sStack_1150 + sStack_1160 + local_14b0) >> 4;
      uVar90 = (ushort)(sStack_114e + sStack_115e + local_14b0) >> 4;
      uVar94 = (ushort)(sStack_114c + sStack_115c + local_14b0) >> 4;
      uVar98 = (ushort)(sStack_114a + sStack_115a + local_14b0) >> 4;
      local_1748 = CONCAT17((uVar95 != 0) * (uVar95 < 0x100) * (char)uVar95 - (0xff < uVar95),
                            CONCAT16((uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 -
                                     (0xff < uVar91),
                                     CONCAT15((uVar87 != 0) * (uVar87 < 0x100) * (char)uVar87 -
                                              (0xff < uVar87),
                                              CONCAT14((uVar83 != 0) * (uVar83 < 0x100) *
                                                       (char)uVar83 - (0xff < uVar83),
                                                       CONCAT13((uVar79 != 0) * (uVar79 < 0x100) *
                                                                (char)uVar79 - (0xff < uVar79),
                                                                CONCAT12((uVar75 != 0) *
                                                                         (uVar75 < 0x100) *
                                                                         (char)uVar75 -
                                                                         (0xff < uVar75),
                                                                         CONCAT11((uVar71 != 0) *
                                                                                  (uVar71 < 0x100) *
                                                                                  (char)uVar71 -
                                                                                  (0xff < uVar71),
                                                                                  (uVar54 != 0) *
                                                                                  (uVar54 < 0x100) *
                                                                                  (char)uVar54 -
                                                                                  (0xff < uVar54))))
                                                      ))));
      local_1758 = CONCAT17((uVar96 != 0) * (uVar96 < 0x100) * (char)uVar96 - (0xff < uVar96),
                            CONCAT16((uVar92 != 0) * (uVar92 < 0x100) * (char)uVar92 -
                                     (0xff < uVar92),
                                     CONCAT15((uVar88 != 0) * (uVar88 < 0x100) * (char)uVar88 -
                                              (0xff < uVar88),
                                              CONCAT14((uVar84 != 0) * (uVar84 < 0x100) *
                                                       (char)uVar84 - (0xff < uVar84),
                                                       CONCAT13((uVar80 != 0) * (uVar80 < 0x100) *
                                                                (char)uVar80 - (0xff < uVar80),
                                                                CONCAT12((uVar76 != 0) *
                                                                         (uVar76 < 0x100) *
                                                                         (char)uVar76 -
                                                                         (0xff < uVar76),
                                                                         CONCAT11((uVar72 != 0) *
                                                                                  (uVar72 < 0x100) *
                                                                                  (char)uVar72 -
                                                                                  (0xff < uVar72),
                                                                                  (uVar55 != 0) *
                                                                                  (uVar55 < 0x100) *
                                                                                  (char)uVar55 -
                                                                                  (0xff < uVar55))))
                                                      ))));
      local_1768 = CONCAT17((uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97),
                            CONCAT16((uVar93 != 0) * (uVar93 < 0x100) * (char)uVar93 -
                                     (0xff < uVar93),
                                     CONCAT15((uVar89 != 0) * (uVar89 < 0x100) * (char)uVar89 -
                                              (0xff < uVar89),
                                              CONCAT14((uVar85 != 0) * (uVar85 < 0x100) *
                                                       (char)uVar85 - (0xff < uVar85),
                                                       CONCAT13((uVar81 != 0) * (uVar81 < 0x100) *
                                                                (char)uVar81 - (0xff < uVar81),
                                                                CONCAT12((uVar77 != 0) *
                                                                         (uVar77 < 0x100) *
                                                                         (char)uVar77 -
                                                                         (0xff < uVar77),
                                                                         CONCAT11((uVar73 != 0) *
                                                                                  (uVar73 < 0x100) *
                                                                                  (char)uVar73 -
                                                                                  (0xff < uVar73),
                                                                                  (uVar56 != 0) *
                                                                                  (uVar56 < 0x100) *
                                                                                  (char)uVar56 -
                                                                                  (0xff < uVar56))))
                                                      ))));
      local_1778 = CONCAT17((uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98),
                            CONCAT16((uVar94 != 0) * (uVar94 < 0x100) * (char)uVar94 -
                                     (0xff < uVar94),
                                     CONCAT15((uVar90 != 0) * (uVar90 < 0x100) * (char)uVar90 -
                                              (0xff < uVar90),
                                              CONCAT14((uVar86 != 0) * (uVar86 < 0x100) *
                                                       (char)uVar86 - (0xff < uVar86),
                                                       CONCAT13((uVar82 != 0) * (uVar82 < 0x100) *
                                                                (char)uVar82 - (0xff < uVar82),
                                                                CONCAT12((uVar78 != 0) *
                                                                         (uVar78 < 0x100) *
                                                                         (char)uVar78 -
                                                                         (0xff < uVar78),
                                                                         CONCAT11((uVar74 != 0) *
                                                                                  (uVar74 < 0x100) *
                                                                                  (char)uVar74 -
                                                                                  (0xff < uVar74),
                                                                                  (uVar57 != 0) *
                                                                                  (uVar57 < 0x100) *
                                                                                  (char)uVar57 -
                                                                                  (0xff < uVar57))))
                                                      ))));
      *(undefined8 *)(in_RDX + (int)(local_14b8 * in_ECX)) = local_1748;
      *(undefined8 *)(in_RDX + (int)((local_14b8 + 1) * in_ECX)) = local_1758;
      *(undefined8 *)(in_RDX + (int)((local_14b8 + 2) * in_ECX)) = local_1768;
      *(undefined8 *)(in_RDX + (int)((local_14b8 + 3) * in_ECX)) = local_1778;
      local_1598._0_4_ = CONCAT22(sStack_886 + -0x400,local_888 + -0x400);
      local_1598._0_6_ = CONCAT24(sStack_884 + -0x400,(undefined4)local_1598);
      local_1598 = CONCAT26(sStack_882 + -0x400,(undefined6)local_1598);
      uStack_1590._0_4_ = CONCAT22(sStack_87e + -0x400,sStack_880 + -0x400);
      uStack_1590._0_6_ = CONCAT24(sStack_87c + -0x400,(undefined4)uStack_1590);
      uStack_1590 = CONCAT26(sStack_87a + -0x400,(undefined6)uStack_1590);
      local_15d8._0_4_ = CONCAT22(sStack_1096 + 0x400,local_1098 + 0x400);
      local_15d8._0_6_ = CONCAT24(sStack_1094 + 0x400,(undefined4)local_15d8);
      local_15d8 = CONCAT26(sStack_1092 + 0x400,(undefined6)local_15d8);
      uStack_15d0._0_4_ = CONCAT22(sStack_108e + 0x400,sStack_1090 + 0x400);
      uStack_15d0._0_6_ = CONCAT24(sStack_108c + 0x400,(undefined4)uStack_15d0);
      uStack_15d0 = CONCAT26(sStack_108a + 0x400,(undefined6)uStack_15d0);
    }
  }
  else {
    bVar1 = *(byte *)((long)(in_R8D * 3) + 1 + in_RDI);
    bVar2 = *(byte *)(in_RDI + (in_R8D + -1));
    for (local_14b8 = 0; (int)local_14b8 < in_R8D; local_14b8 = local_14b8 + 1) {
      bVar3 = *(byte *)(in_RDI + (int)(~local_14b8 + iVar6));
      sVar50 = (ushort)local_14b8 + 1;
      sVar51 = ~(ushort)local_14b8 + local_14b0;
      local_1538 = 0x4000300020001;
      _local_1548 = CONCAT22(local_14b0 + -2,local_14b0 + -1);
      _local_1548 = CONCAT24(local_14b0 + -3,_local_1548);
      _local_1548 = CONCAT26(local_14b0 + -4,_local_1548);
      uStack_166 = (ushort)bVar2;
      uStack_164 = (ushort)bVar2;
      for (local_14bc = 0; local_14bc < in_R8D; local_14bc = local_14bc + 4) {
        uVar4 = *(undefined8 *)((long)local_14bc + 1 + in_RDI + iVar6);
        bStack_13b7 = (byte)((ulong)uVar4 >> 8);
        bStack_13b6 = (byte)((ulong)uVar4 >> 0x10);
        bStack_13b5 = (byte)((ulong)uVar4 >> 0x18);
        uStack_176 = (ushort)bStack_13b7;
        uStack_174 = (ushort)bStack_13b6;
        uStack_172 = (ushort)bStack_13b5;
        sVar58 = (ushort)(byte)uVar4 * sVar51;
        cStack_17f6 = (char)(uStack_176 * sVar51);
        bStack_17f5 = (byte)((ushort)(uStack_176 * sVar51) >> 8);
        cStack_17f4 = (char)(uStack_174 * sVar51);
        bStack_17f3 = (byte)((ushort)(uStack_174 * sVar51) >> 8);
        cStack_17f2 = (char)(uStack_172 * sVar51);
        bStack_17f1 = (byte)((ushort)(uStack_172 * sVar51) >> 8);
        uStack_196 = (ushort)bVar1;
        uStack_194 = (ushort)bVar1;
        local_1a8 = (short)local_1538;
        sStack_1a6 = (short)((ulong)local_1538 >> 0x10);
        sStack_1a4 = (short)((ulong)local_1538 >> 0x20);
        sStack_1a2 = (short)((ulong)local_1538 >> 0x30);
        uStack_1b6 = (ushort)bVar3;
        uStack_1b4 = (ushort)bVar3;
        local_1c8 = (short)_local_1548;
        sStack_1c6 = (short)((ulong)_local_1548 >> 0x10);
        sStack_1c4 = (short)((ulong)_local_1548 >> 0x20);
        sStack_1c2 = (short)((ulong)_local_1548 >> 0x30);
        uVar11 = CONCAT13(bStack_17f5,CONCAT12(cStack_17f6,sVar58));
        uVar12 = CONCAT15(bStack_17f3,CONCAT14(cStack_17f4,uVar11));
        sStack_1246 = (short)((uint)uVar11 >> 0x10);
        sStack_1244 = (short)((uint6)uVar12 >> 0x20);
        sStack_1242 = (short)(CONCAT17(bStack_17f1,CONCAT16(cStack_17f2,uVar12)) >> 0x30);
        sVar58 = sVar50 * (ushort)bVar2 + local_14b0 + sVar58;
        sStack_1246 = sVar50 * uStack_166 + local_14b0 + sStack_1246;
        sStack_1244 = sVar50 * uStack_164 + local_14b0 + sStack_1244;
        sStack_1242 = sVar50 * (ushort)bVar2 + local_14b0 + sStack_1242;
        cStack_17f6 = (char)sStack_1246;
        bStack_17f5 = (byte)((ushort)sStack_1246 >> 8);
        cStack_17f4 = (char)sStack_1244;
        bStack_17f3 = (byte)((ushort)sStack_1244 >> 8);
        cStack_17f2 = (char)sStack_1242;
        bStack_17f1 = (byte)((ushort)sStack_1242 >> 8);
        uVar11 = CONCAT13(bStack_17f5,CONCAT12(cStack_17f6,sVar58));
        uVar12 = CONCAT15(bStack_17f3,CONCAT14(cStack_17f4,uVar11));
        sStack_1256 = (short)((uint)uVar11 >> 0x10);
        sStack_1254 = (short)((uint6)uVar12 >> 0x20);
        sStack_1252 = (short)(CONCAT17(bStack_17f1,CONCAT16(cStack_17f2,uVar12)) >> 0x30);
        sVar58 = sVar58 + (ushort)bVar1 * local_1a8;
        sStack_1256 = sStack_1256 + uStack_196 * sStack_1a6;
        sStack_1254 = sStack_1254 + uStack_194 * sStack_1a4;
        sStack_1252 = sStack_1252 + (ushort)bVar1 * sStack_1a2;
        cStack_17f6 = (char)sStack_1256;
        bStack_17f5 = (byte)((ushort)sStack_1256 >> 8);
        cStack_17f4 = (char)sStack_1254;
        bStack_17f3 = (byte)((ushort)sStack_1254 >> 8);
        cStack_17f2 = (char)sStack_1252;
        bStack_17f1 = (byte)((ushort)sStack_1252 >> 8);
        uVar11 = CONCAT13(bStack_17f5,CONCAT12(cStack_17f6,sVar58));
        uVar12 = CONCAT15(bStack_17f3,CONCAT14(cStack_17f4,uVar11));
        sStack_1276 = (short)((uint)uVar11 >> 0x10);
        sStack_1274 = (short)((uint6)uVar12 >> 0x20);
        sStack_1272 = (short)(CONCAT17(bStack_17f1,CONCAT16(cStack_17f2,uVar12)) >> 0x30);
        uVar54 = sVar58 + (ushort)bVar3 * local_1c8;
        sStack_1276 = sStack_1276 + uStack_1b6 * sStack_1c6;
        sStack_1274 = sStack_1274 + uStack_1b4 * sStack_1c4;
        sStack_1272 = sStack_1272 + (ushort)bVar3 * sStack_1c2;
        cStack_17f6 = (char)sStack_1276;
        bStack_17f5 = (byte)((ushort)sStack_1276 >> 8);
        cStack_17f4 = (char)sStack_1274;
        bStack_17f3 = (byte)((ushort)sStack_1274 >> 8);
        cStack_17f2 = (char)sStack_1272;
        bStack_17f1 = (byte)((ushort)sStack_1272 >> 8);
        uVar11 = CONCAT13(bStack_17f5,CONCAT12(cStack_17f6,uVar54));
        uVar12 = CONCAT15(bStack_17f3,CONCAT14(cStack_17f4,uVar11));
        uVar54 = uVar54 >> 3;
        cStack_17f6 = (char)(ushort)((uint)uVar11 >> 0x13);
        bStack_17f5 = bStack_17f5 >> 3;
        cStack_17f4 = (char)(ushort)((uint6)uVar12 >> 0x23);
        bStack_17f3 = bStack_17f3 >> 3;
        cStack_17f2 = (char)(ushort)(CONCAT17(bStack_17f1,CONCAT16(cStack_17f2,uVar12)) >> 0x33);
        bStack_17f1 = bStack_17f1 >> 3;
        uVar11 = CONCAT13(bStack_17f5,CONCAT12(cStack_17f6,uVar54));
        uVar12 = CONCAT15(bStack_17f3,CONCAT14(cStack_17f4,uVar11));
        uStack_d76 = (ushort)((uint)uVar11 >> 0x10);
        uStack_d74 = (ushort)((uint6)uVar12 >> 0x20);
        uStack_d72 = (ushort)(CONCAT17(bStack_17f1,CONCAT16(cStack_17f2,uVar12)) >> 0x30);
        *(uint *)(in_RDX + (int)(local_14b8 * in_ECX + local_14bc)) =
             CONCAT13((uStack_d72 != 0) * (uStack_d72 < 0x100) * cStack_17f2 - (0xff < uStack_d72),
                      CONCAT12((uStack_d74 != 0) * (uStack_d74 < 0x100) * cStack_17f4 -
                               (0xff < uStack_d74),
                               CONCAT11((uStack_d76 != 0) * (uStack_d76 < 0x100) * cStack_17f6 -
                                        (0xff < uStack_d76),
                                        (uVar54 != 0) * (uVar54 < 0x100) * (char)uVar54 -
                                        (0xff < uVar54))));
        _local_1548 = CONCAT22(sStack_1c6 + -4,local_1c8 + -4);
        _local_1548 = CONCAT24(sStack_1c4 + -4,_local_1548);
        _local_1548 = CONCAT26(sStack_1c2 + -4,_local_1548);
        local_1538 = CONCAT26(sStack_1a2 + 4,
                              CONCAT24(sStack_1a4 + 4,CONCAT22(sStack_1a6 + 4,local_1a8 + 4)));
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_planar_ssse3(UWORD8 *pu1_ref,
                                        WORD32 src_strd,
                                        UWORD8 *pu1_dst,
                                        WORD32 dst_strd,
                                        WORD32 nt,
                                        WORD32 mode)
{


    WORD32 row, col;
    WORD32 two_nt, three_nt;
    UWORD16 temp;

    __m128i pu1_ref_16x8b, const_temp_4x32b, const_temp1_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i col_8x16b, const_temp5_4x32b, const_temp6_4x32b, zero_8x16b, const_temp7_4x32b, const_temp8_4x32b;
    __m128i nt_row_16x8b, nt_row1_16x8b, nt_row2_16x8b, nt_row3_16x8b; //nt-1-row
    __m128i row_16x8b, row1_16x8b, row2_16x8b, row3_16x8b; //row+1
    UNUSED(src_strd);
    UNUSED(mode);

    two_nt = 2 * nt;
    three_nt = 3 * nt;

    /* Planar filtering */
    temp = pu1_ref[nt - 1];
    temp = (temp << 8) | ((UWORD16)pu1_ref[three_nt + 1]);
    /* setting vallues in  registera*/
    pu1_ref_16x8b  = _mm_set1_epi16(temp);
    const_temp6_4x32b = _mm_set1_epi16(nt);



    if(nt == 32) /* for nt multiple of 8*/
    {


        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        const_temp8_4x32b = _mm_set1_epi16(0x0008);
        //(nt-1-y) (nt-1-x) ; x= 0..15 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x1f18, 0x1f19, 0x1f1a, 0x1f1b, 0x1f1c, 0x1f1d, 0x1f1e, 0x1f1f);
        //(y+1) (x+1) ; x= 0..15 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 1)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b, src_temp1_8x16b;


            res_temp1_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);

            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp8_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp8_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp8_4x32b);
            row2_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp8_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row2_16x8b, const_temp8_4x32b);
            row3_16x8b    = _mm_add_epi16(row2_16x8b,    const_temp8_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 17));

            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp1_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp1_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 6); //log2(32)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 6);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 6);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 6);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, res_temp1_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp2_8x16b, res_temp3_8x16b);


            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd) + 16), res_temp1_8x16b);


            nt_row_16x8b = _mm_sub_epi16(nt_row_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row_16x8b,    const_temp1_4x32b);
        }
    }
    else if(nt == 16) /* for nt multiple of 8*/
    {

        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        const_temp8_4x32b = _mm_set1_epi16(0x0008);
        //(nt-1-y) (nt-1-x) ; x= 0..15 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x0f08, 0x0f09, 0x0f0a, 0x0f0b, 0x0f0c, 0x0f0d, 0x0f0e, 0x0f0f);
        //(y+1) (x+1) ; x= 0..15 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 2)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b;


            res_temp1_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);
            res_temp2_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 2 - row]);


            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp1_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp1_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp8_4x32b);
            row2_16x8b    = _mm_add_epi16(row_16x8b,     const_temp8_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp8_4x32b);
            row3_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp8_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));


            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpacklo_epi8(res_temp2_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpackhi_epi8(res_temp1_8x16b, src_temp_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpackhi_epi8(res_temp2_8x16b, src_temp_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 5); //log2(16)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 5);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 5);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 5);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, res_temp2_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, res_temp3_8x16b);

            _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), res_temp1_8x16b);

            nt_row_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp1_4x32b);
        }
    }
    else if(nt == 8)
    {


        const_temp4_4x32b = _mm_set1_epi16(0x0400);
        const_temp1_4x32b = _mm_set1_epi16(0x0100);
        zero_8x16b = _mm_set1_epi32(0);

        //(nt-1-y) (nt-1-x) ; x= 0..7 , y = row
        //const_temp5_4x32b = _mm_set_epi8(nt_row, 0,nt_row, 1,nt_row, 2,nt_row, 3,nt_row, 4,nt_row, 5,nt_row, 6,nt_row, 7);
        nt_row_16x8b = _mm_set_epi16(0x0700, 0x0701, 0x0702, 0x0703, 0x0704, 0x0705, 0x0706, 0x0707);
        //(y+1) (x+1) ; x= 0..7 , y = row
        //const_temp3_4x32b = _mm_set_epi16(row1,8,row1, 7,row1, 6, row1, 5,row1, 4, row1, 3, row1, 2, row1, 1);
        row_16x8b = _mm_set_epi16(0x0108, 0x0107, 0x0106, 0x0105, 0x0104, 0x0103, 0x0102, 0x0101);

        for(row = 0; row < nt; row += 4)
        {
            __m128i res_temp_8x16b, res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b;
            __m128i res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b;

            __m128i src_temp_8x16b;


            res_temp4_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 1 - row]);
            res_temp5_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 2 - row]);
            res_temp6_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 3 - row]);
            res_temp7_8x16b  = _mm_set1_epi8(pu1_ref[two_nt - 4 - row]);

            nt_row1_16x8b = _mm_sub_epi16(nt_row_16x8b,  const_temp1_4x32b);
            row1_16x8b    = _mm_add_epi16(row_16x8b,     const_temp1_4x32b);
            nt_row2_16x8b = _mm_sub_epi16(nt_row1_16x8b, const_temp1_4x32b);
            row2_16x8b    = _mm_add_epi16(row1_16x8b,    const_temp1_4x32b);
            nt_row3_16x8b = _mm_sub_epi16(nt_row2_16x8b, const_temp1_4x32b);
            row3_16x8b    = _mm_add_epi16(row2_16x8b,    const_temp1_4x32b);
            /* loding 8bit 16 pixles*/
            src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            res_temp4_8x16b =  _mm_unpacklo_epi8(res_temp4_8x16b, src_temp_8x16b); /* row=0*/
            res_temp5_8x16b =  _mm_unpacklo_epi8(res_temp5_8x16b, src_temp_8x16b); /* row=1*/
            res_temp6_8x16b =  _mm_unpacklo_epi8(res_temp6_8x16b, src_temp_8x16b); /* row=2*/
            res_temp7_8x16b =  _mm_unpacklo_epi8(res_temp7_8x16b, src_temp_8x16b); /* row=3*/

            /*(row + 1) * pu1_ref[nt - 1] + (col + 1) * pu1_ref[three_nt + 1] */
            res_temp_8x16b  = _mm_maddubs_epi16(pu1_ref_16x8b, row_16x8b);
            res_temp1_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row1_16x8b);
            res_temp2_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row2_16x8b);
            res_temp3_8x16b = _mm_maddubs_epi16(pu1_ref_16x8b, row3_16x8b);
            /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] + (nt - 1 - col)* pu1_ref[two_nt - 1 - row] */
            res_temp4_8x16b = _mm_maddubs_epi16(res_temp4_8x16b, nt_row_16x8b);
            res_temp5_8x16b = _mm_maddubs_epi16(res_temp5_8x16b, nt_row1_16x8b);
            res_temp6_8x16b = _mm_maddubs_epi16(res_temp6_8x16b, nt_row2_16x8b);
            res_temp7_8x16b = _mm_maddubs_epi16(res_temp7_8x16b, nt_row3_16x8b);

            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, res_temp4_8x16b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp5_8x16b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, res_temp6_8x16b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp7_8x16b);
            /*res_temp + nt)*/
            res_temp_8x16b  = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);
            res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, const_temp6_4x32b);
            res_temp2_8x16b = _mm_add_epi16(res_temp2_8x16b, const_temp6_4x32b);
            res_temp3_8x16b = _mm_add_epi16(res_temp3_8x16b, const_temp6_4x32b);

            res_temp_8x16b  = _mm_srli_epi16(res_temp_8x16b, 4); //log2(16)+1
            res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 4);
            res_temp2_8x16b = _mm_srli_epi16(res_temp2_8x16b, 4);
            res_temp3_8x16b = _mm_srli_epi16(res_temp3_8x16b, 4);

            res_temp_8x16b  = _mm_packus_epi16(res_temp_8x16b, zero_8x16b);
            res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);
            res_temp2_8x16b = _mm_packus_epi16(res_temp2_8x16b, zero_8x16b);
            res_temp3_8x16b = _mm_packus_epi16(res_temp3_8x16b, zero_8x16b);

            _mm_storel_epi64((__m128i *)(pu1_dst + (row * dst_strd)), res_temp_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), res_temp1_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), res_temp2_8x16b);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), res_temp3_8x16b);

            nt_row_16x8b = _mm_sub_epi16(nt_row3_16x8b, const_temp1_4x32b);
            row_16x8b    = _mm_add_epi16(row3_16x8b,    const_temp1_4x32b);
        }
    }
    else
    {

        /* for nt multiple of 4*/
        const_temp7_4x32b = _mm_set1_epi16(4);
        const_temp4_4x32b = _mm_set1_epi16(nt - 1);
        const_temp_4x32b  = _mm_set1_epi16(pu1_ref[three_nt + 1]);
        const_temp1_4x32b = _mm_set1_epi16(pu1_ref[nt - 1]);
        zero_8x16b = _mm_set1_epi32(0);

        for(row = 0; row < nt; row++)
        {
            __m128i res_temp_8x16b, row_8x16b, res_temp1_8x16b, res_temp2_8x16b;
            __m128i res_temp3_8x16b;

            const_temp2_4x32b  = _mm_set1_epi16(pu1_ref[two_nt - 1 - row]);
            const_temp3_4x32b  = _mm_set1_epi16((row + 1));


            row_8x16b = _mm_set1_epi16((nt - 1 - row));

            const_temp5_4x32b = _mm_set_epi16(7, 6, 5, 4, 3, 2, 1, 0);
            col_8x16b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);

            const_temp5_4x32b = _mm_sub_epi16(const_temp4_4x32b, const_temp5_4x32b);

            /*(row + 1) * pu1_ref[nt - 1]*/
            res_temp_8x16b  = _mm_mullo_epi16(const_temp3_4x32b,  const_temp1_4x32b);

            /*(row + 1) * pu1_ref[nt - 1] + nt)*/
            res_temp_8x16b = _mm_add_epi16(res_temp_8x16b, const_temp6_4x32b);

            for(col = 0; col < nt; col += 4)
            {
                __m128i src_temp_8x16b;
                int temp1;

                /* loding 8bit 16 pixles*/
                src_temp_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + col));

                src_temp_8x16b =  _mm_unpacklo_epi8(src_temp_8x16b, zero_8x16b); /* row=0*/

                /* (nt - 1 - row) * pu1_ref[two_nt + 1 + col] */
                res_temp1_8x16b  = _mm_mullo_epi16(src_temp_8x16b,  row_8x16b);

                /*(col + 1) * pu1_ref[three_nt + 1]*/
                res_temp2_8x16b  = _mm_mullo_epi16(const_temp_4x32b,  col_8x16b);

                /*(nt - 1 - col)* pu1_ref[two_nt - 1 - row]*/
                res_temp3_8x16b  = _mm_mullo_epi16(const_temp2_4x32b,  const_temp5_4x32b);

                res_temp1_8x16b = _mm_add_epi16(res_temp_8x16b, res_temp1_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                res_temp1_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp3_8x16b);

                res_temp1_8x16b = _mm_srli_epi16(res_temp1_8x16b, 3); //log2(16)+1
                res_temp1_8x16b = _mm_packus_epi16(res_temp1_8x16b, zero_8x16b);

                temp1 = _mm_cvtsi128_si32(res_temp1_8x16b);

                *(WORD32 *)(&pu1_dst[(row * dst_strd) + col]) = temp1;

                const_temp5_4x32b = _mm_sub_epi16(const_temp5_4x32b, const_temp7_4x32b);
                col_8x16b = _mm_add_epi16(col_8x16b, const_temp7_4x32b);
            } /* inner loop ends here */
        }
    }


}